

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O3

bool embree::avx512::CurveNiMBIntersector1<4>::
     occluded_t<embree::avx512::SweepCurve1Intersector1<embree::BSplineCurveT>,embree::avx512::Occluded1Epilog1<true>>
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar2;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar3;
  Primitive PVar4;
  Geometry *pGVar5;
  __int_type_conflict _Var6;
  long lVar7;
  long lVar8;
  RTCFilterFunctionN p_Var9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  undefined1 auVar20 [16];
  undefined8 uVar21;
  undefined8 uVar22;
  ulong uVar23;
  undefined8 uVar24;
  int iVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  byte bVar58;
  byte bVar59;
  byte bVar60;
  byte bVar61;
  long lVar62;
  bool bVar63;
  long lVar64;
  bool bVar65;
  ulong uVar66;
  ulong uVar67;
  ulong uVar68;
  uint uVar69;
  uint uVar124;
  uint uVar125;
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  uint uVar127;
  uint uVar128;
  uint uVar129;
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  uint uVar126;
  uint uVar130;
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  float fVar131;
  undefined4 uVar132;
  float fVar151;
  float fVar152;
  vint4 bi_2;
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  float fVar153;
  float fVar154;
  float fVar155;
  float fVar156;
  undefined1 auVar145 [32];
  undefined1 auVar137 [16];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  vint4 bi_1;
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  float fVar175;
  float fVar176;
  float fVar198;
  float fVar199;
  vint4 bi;
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  float fVar200;
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  float fVar201;
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  float fVar216;
  float fVar217;
  undefined1 auVar215 [32];
  vint4 ai_2;
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [32];
  undefined1 auVar224 [32];
  vint4 ai_1;
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  float fVar233;
  undefined1 auVar231 [32];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar232 [64];
  vint4 ai;
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [32];
  undefined1 auVar238 [64];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [32];
  undefined1 auVar244 [32];
  undefined1 auVar245 [64];
  float fVar246;
  float fVar250;
  float fVar251;
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  float fVar252;
  undefined1 auVar249 [64];
  undefined1 auVar253 [64];
  undefined1 auVar254 [16];
  float fVar257;
  undefined1 auVar255 [32];
  undefined1 auVar258 [32];
  undefined1 auVar259 [32];
  undefined1 auVar260 [64];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [64];
  undefined1 auVar264 [16];
  float fVar266;
  float fVar267;
  undefined1 auVar265 [16];
  undefined1 auVar268 [64];
  undefined1 auVar269 [64];
  undefined1 auVar270 [64];
  undefined1 auVar271 [64];
  undefined1 auVar272 [64];
  undefined1 auVar273 [64];
  undefined1 auVar274 [64];
  undefined1 auVar275 [64];
  undefined1 auVar276 [64];
  undefined1 auVar277 [64];
  undefined1 auVar278 [64];
  undefined1 auVar279 [64];
  undefined1 auVar280 [64];
  undefined1 auVar281 [64];
  RTCFilterFunctionNArguments args;
  BBox<embree::vfloat_impl<8>_> tp1;
  vfloatx_conflict vu0;
  vfloat<8> dOdO;
  StackEntry stack [3];
  int local_8f0;
  undefined2 local_8ea;
  ulong local_8e8;
  undefined1 local_8e0 [32];
  undefined1 local_8c0 [8];
  float fStack_8b8;
  float fStack_8b4;
  float fStack_8b0;
  float fStack_8ac;
  float fStack_8a8;
  float fStack_8a4;
  float local_890;
  float fStack_88c;
  float fStack_888;
  float fStack_884;
  undefined1 local_880 [16];
  undefined4 local_86c;
  uint local_868;
  int local_864;
  undefined1 local_860 [32];
  undefined1 local_840 [32];
  undefined1 local_820 [32];
  undefined1 local_800 [32];
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [32];
  undefined1 local_780 [32];
  undefined1 local_760 [32];
  RTCFilterFunctionNArguments local_730;
  undefined1 local_700 [32];
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined8 local_5e0;
  undefined4 local_5d8;
  float local_5d4;
  undefined4 local_5d0;
  undefined4 local_5cc;
  undefined4 local_5c8;
  uint local_5c4;
  uint local_5c0;
  ulong local_5a8;
  undefined1 local_5a0 [8];
  float fStack_598;
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  float fStack_588;
  float fStack_584;
  undefined1 local_580 [32];
  undefined1 local_560 [8];
  float fStack_558;
  float fStack_554;
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [8];
  float fStack_4d8;
  float fStack_4d4;
  float fStack_4d0;
  float fStack_4cc;
  float fStack_4c8;
  undefined1 local_4c0 [32];
  undefined1 local_490 [16];
  undefined1 local_480 [16];
  undefined1 local_470 [8];
  float fStack_468;
  float fStack_464;
  undefined1 local_460 [16];
  undefined1 local_450 [16];
  undefined1 local_440 [16];
  Primitive *local_430;
  ulong local_428;
  undefined1 local_420 [32];
  undefined1 local_400 [8];
  float fStack_3f8;
  float fStack_3f4;
  undefined1 auStack_3f0 [16];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined4 local_3a0;
  undefined4 uStack_39c;
  undefined4 uStack_398;
  undefined4 uStack_394;
  undefined4 uStack_390;
  undefined4 uStack_38c;
  undefined4 uStack_388;
  undefined4 uStack_384;
  undefined1 local_380 [32];
  float local_360;
  float fStack_35c;
  float fStack_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  float fStack_344;
  undefined1 local_340 [16];
  undefined1 local_330 [16];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [8];
  float fStack_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float fStack_2a8;
  float fStack_2a4;
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [8];
  float fStack_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  byte abStack_180 [32];
  undefined1 auStack_160 [32];
  ulong uStack_140;
  int aiStack_138 [66];
  undefined1 auVar114 [32];
  undefined1 auVar256 [64];
  
  PVar4 = prim[1];
  uVar67 = (ulong)(byte)PVar4;
  lVar62 = uVar67 * 0x25;
  fVar201 = *(float *)(prim + lVar62 + 0x12);
  auVar77 = vsubps_avx((undefined1  [16])(ray->org).field_0,
                       *(undefined1 (*) [16])(prim + lVar62 + 6));
  auVar177._0_4_ = fVar201 * (ray->dir).field_0.m128[0];
  auVar177._4_4_ = fVar201 * (ray->dir).field_0.m128[1];
  auVar177._8_4_ = fVar201 * (ray->dir).field_0.m128[2];
  auVar177._12_4_ = fVar201 * (ray->dir).field_0.m128[3];
  auVar78 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar67 * 4 + 6)));
  auVar218._0_4_ = fVar201 * auVar77._0_4_;
  auVar218._4_4_ = fVar201 * auVar77._4_4_;
  auVar218._8_4_ = fVar201 * auVar77._8_4_;
  auVar218._12_4_ = fVar201 * auVar77._12_4_;
  auVar78 = vcvtdq2ps_avx(auVar78);
  auVar77 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar67 * 5 + 6)));
  auVar77 = vcvtdq2ps_avx(auVar77);
  auVar71 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar67 * 6 + 6)));
  auVar81 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar67 * 0xf + 6)));
  auVar71 = vcvtdq2ps_avx(auVar71);
  auVar81 = vcvtdq2ps_avx(auVar81);
  auVar236 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar4 * 0x10 + 6)));
  auVar236 = vcvtdq2ps_avx(auVar236);
  auVar72 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar4 * 0x10 + uVar67 + 6)));
  auVar72 = vcvtdq2ps_avx(auVar72);
  auVar79 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar67 * 0x1a + 6)));
  auVar79 = vcvtdq2ps_avx(auVar79);
  auVar254 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar67 * 0x1b + 6)));
  auVar254 = vcvtdq2ps_avx(auVar254);
  auVar73 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar67 * 0x1c + 6)));
  auVar73 = vcvtdq2ps_avx(auVar73);
  auVar225._4_4_ = auVar177._0_4_;
  auVar225._0_4_ = auVar177._0_4_;
  auVar225._8_4_ = auVar177._0_4_;
  auVar225._12_4_ = auVar177._0_4_;
  auVar80 = vshufps_avx(auVar177,auVar177,0x55);
  auVar20 = vshufps_avx(auVar177,auVar177,0xaa);
  fVar201 = auVar20._0_4_;
  auVar178._0_4_ = fVar201 * auVar71._0_4_;
  fVar246 = auVar20._4_4_;
  auVar178._4_4_ = fVar246 * auVar71._4_4_;
  fVar250 = auVar20._8_4_;
  auVar178._8_4_ = fVar250 * auVar71._8_4_;
  fVar251 = auVar20._12_4_;
  auVar178._12_4_ = fVar251 * auVar71._12_4_;
  auVar157._0_4_ = auVar72._0_4_ * fVar201;
  auVar157._4_4_ = auVar72._4_4_ * fVar246;
  auVar157._8_4_ = auVar72._8_4_ * fVar250;
  auVar157._12_4_ = auVar72._12_4_ * fVar251;
  auVar133._0_4_ = auVar73._0_4_ * fVar201;
  auVar133._4_4_ = auVar73._4_4_ * fVar246;
  auVar133._8_4_ = auVar73._8_4_ * fVar250;
  auVar133._12_4_ = auVar73._12_4_ * fVar251;
  auVar20 = vfmadd231ps_fma(auVar178,auVar80,auVar77);
  auVar27 = vfmadd231ps_fma(auVar157,auVar80,auVar236);
  auVar80 = vfmadd231ps_fma(auVar133,auVar254,auVar80);
  auVar20 = vfmadd231ps_fma(auVar20,auVar225,auVar78);
  auVar27 = vfmadd231ps_fma(auVar27,auVar225,auVar81);
  auVar28 = vfmadd231ps_fma(auVar80,auVar79,auVar225);
  auVar264._4_4_ = auVar218._0_4_;
  auVar264._0_4_ = auVar218._0_4_;
  auVar264._8_4_ = auVar218._0_4_;
  auVar264._12_4_ = auVar218._0_4_;
  auVar80 = vshufps_avx(auVar218,auVar218,0x55);
  auVar70 = vshufps_avx512vl(auVar218,auVar218,0xaa);
  auVar71 = vmulps_avx512vl(auVar70,auVar71);
  auVar72 = vmulps_avx512vl(auVar70,auVar72);
  auVar73 = vmulps_avx512vl(auVar70,auVar73);
  auVar77 = vfmadd231ps_fma(auVar71,auVar80,auVar77);
  auVar71 = vfmadd231ps_fma(auVar72,auVar80,auVar236);
  auVar236 = vfmadd231ps_fma(auVar73,auVar80,auVar254);
  auVar29 = vfmadd231ps_fma(auVar77,auVar264,auVar78);
  auVar133 = vfmadd231ps_fma(auVar71,auVar264,auVar81);
  auVar247._8_4_ = 0x7fffffff;
  auVar247._0_8_ = 0x7fffffff7fffffff;
  auVar247._12_4_ = 0x7fffffff;
  auVar134 = vfmadd231ps_fma(auVar236,auVar264,auVar79);
  auVar78 = vandps_avx(auVar247,auVar20);
  auVar239._8_4_ = 0x219392ef;
  auVar239._0_8_ = 0x219392ef219392ef;
  auVar239._12_4_ = 0x219392ef;
  uVar66 = vcmpps_avx512vl(auVar78,auVar239,1);
  bVar63 = (bool)((byte)uVar66 & 1);
  auVar74._0_4_ = (uint)bVar63 * 0x219392ef | (uint)!bVar63 * auVar20._0_4_;
  bVar63 = (bool)((byte)(uVar66 >> 1) & 1);
  auVar74._4_4_ = (uint)bVar63 * 0x219392ef | (uint)!bVar63 * auVar20._4_4_;
  bVar63 = (bool)((byte)(uVar66 >> 2) & 1);
  auVar74._8_4_ = (uint)bVar63 * 0x219392ef | (uint)!bVar63 * auVar20._8_4_;
  bVar63 = (bool)((byte)(uVar66 >> 3) & 1);
  auVar74._12_4_ = (uint)bVar63 * 0x219392ef | (uint)!bVar63 * auVar20._12_4_;
  auVar78 = vandps_avx(auVar247,auVar27);
  uVar66 = vcmpps_avx512vl(auVar78,auVar239,1);
  bVar63 = (bool)((byte)uVar66 & 1);
  auVar75._0_4_ = (uint)bVar63 * 0x219392ef | (uint)!bVar63 * auVar27._0_4_;
  bVar63 = (bool)((byte)(uVar66 >> 1) & 1);
  auVar75._4_4_ = (uint)bVar63 * 0x219392ef | (uint)!bVar63 * auVar27._4_4_;
  bVar63 = (bool)((byte)(uVar66 >> 2) & 1);
  auVar75._8_4_ = (uint)bVar63 * 0x219392ef | (uint)!bVar63 * auVar27._8_4_;
  bVar63 = (bool)((byte)(uVar66 >> 3) & 1);
  auVar75._12_4_ = (uint)bVar63 * 0x219392ef | (uint)!bVar63 * auVar27._12_4_;
  auVar78 = vandps_avx(auVar247,auVar28);
  uVar66 = vcmpps_avx512vl(auVar78,auVar239,1);
  bVar63 = (bool)((byte)uVar66 & 1);
  auVar76._0_4_ = (uint)bVar63 * 0x219392ef | (uint)!bVar63 * auVar28._0_4_;
  bVar63 = (bool)((byte)(uVar66 >> 1) & 1);
  auVar76._4_4_ = (uint)bVar63 * 0x219392ef | (uint)!bVar63 * auVar28._4_4_;
  bVar63 = (bool)((byte)(uVar66 >> 2) & 1);
  auVar76._8_4_ = (uint)bVar63 * 0x219392ef | (uint)!bVar63 * auVar28._8_4_;
  bVar63 = (bool)((byte)(uVar66 >> 3) & 1);
  auVar76._12_4_ = (uint)bVar63 * 0x219392ef | (uint)!bVar63 * auVar28._12_4_;
  auVar77 = vrcp14ps_avx512vl(auVar74);
  auVar240._8_4_ = 0x3f800000;
  auVar240._0_8_ = 0x3f8000003f800000;
  auVar240._12_4_ = 0x3f800000;
  auVar78 = vfnmadd213ps_fma(auVar74,auVar77,auVar240);
  auVar28 = vfmadd132ps_fma(auVar78,auVar77,auVar77);
  auVar77 = vrcp14ps_avx512vl(auVar75);
  auVar78 = vfnmadd213ps_fma(auVar75,auVar77,auVar240);
  auVar70 = vfmadd132ps_fma(auVar78,auVar77,auVar77);
  auVar77 = vrcp14ps_avx512vl(auVar76);
  auVar78 = vfnmadd213ps_fma(auVar76,auVar77,auVar240);
  auVar26 = vfmadd132ps_fma(auVar78,auVar77,auVar77);
  fVar201 = ((ray->dir).field_0.m128[3] - *(float *)(prim + lVar62 + 0x16)) *
            *(float *)(prim + lVar62 + 0x1a);
  auVar234._4_4_ = fVar201;
  auVar234._0_4_ = fVar201;
  auVar234._8_4_ = fVar201;
  auVar234._12_4_ = fVar201;
  auVar78._8_8_ = 0;
  auVar78._0_8_ = *(ulong *)(prim + uVar67 * 7 + 6);
  auVar78 = vpmovsxwd_avx(auVar78);
  auVar78 = vcvtdq2ps_avx(auVar78);
  auVar77._8_8_ = 0;
  auVar77._0_8_ = *(ulong *)(prim + uVar67 * 0xb + 6);
  auVar77 = vpmovsxwd_avx(auVar77);
  auVar77 = vcvtdq2ps_avx(auVar77);
  auVar81 = vsubps_avx(auVar77,auVar78);
  auVar71._8_8_ = 0;
  auVar71._0_8_ = *(ulong *)(prim + uVar67 * 9 + 6);
  auVar77 = vpmovsxwd_avx(auVar71);
  auVar71 = vfmadd213ps_fma(auVar81,auVar234,auVar78);
  auVar78 = vcvtdq2ps_avx(auVar77);
  auVar81._8_8_ = 0;
  auVar81._0_8_ = *(ulong *)(prim + uVar67 * 0xd + 6);
  auVar77 = vpmovsxwd_avx(auVar81);
  auVar77 = vcvtdq2ps_avx(auVar77);
  auVar77 = vsubps_avx(auVar77,auVar78);
  auVar81 = vfmadd213ps_fma(auVar77,auVar234,auVar78);
  auVar236._8_8_ = 0;
  auVar236._0_8_ = *(ulong *)(prim + uVar67 * 0x12 + 6);
  auVar78 = vpmovsxwd_avx(auVar236);
  auVar78 = vcvtdq2ps_avx(auVar78);
  uVar66 = (ulong)(uint)((int)(uVar67 * 5) << 2);
  auVar72._8_8_ = 0;
  auVar72._0_8_ = *(ulong *)(prim + uVar67 * 2 + uVar66 + 6);
  auVar77 = vpmovsxwd_avx(auVar72);
  auVar77 = vcvtdq2ps_avx(auVar77);
  auVar77 = vsubps_avx(auVar77,auVar78);
  auVar236 = vfmadd213ps_fma(auVar77,auVar234,auVar78);
  auVar79._8_8_ = 0;
  auVar79._0_8_ = *(ulong *)(prim + uVar66 + 6);
  auVar78 = vpmovsxwd_avx(auVar79);
  auVar78 = vcvtdq2ps_avx(auVar78);
  auVar254._8_8_ = 0;
  auVar254._0_8_ = *(ulong *)(prim + uVar67 * 0x18 + 6);
  auVar77 = vpmovsxwd_avx(auVar254);
  auVar77 = vcvtdq2ps_avx(auVar77);
  auVar77 = vsubps_avx(auVar77,auVar78);
  auVar72 = vfmadd213ps_fma(auVar77,auVar234,auVar78);
  auVar260 = ZEXT1664(auVar72);
  auVar73._8_8_ = 0;
  auVar73._0_8_ = *(ulong *)(prim + uVar67 * 0x1d + 6);
  auVar78 = vpmovsxwd_avx(auVar73);
  auVar78 = vcvtdq2ps_avx(auVar78);
  auVar80._8_8_ = 0;
  auVar80._0_8_ = *(ulong *)(prim + uVar67 + (ulong)(byte)PVar4 * 0x20 + 6);
  auVar77 = vpmovsxwd_avx(auVar80);
  auVar77 = vcvtdq2ps_avx(auVar77);
  auVar77 = vsubps_avx(auVar77,auVar78);
  auVar79 = vfmadd213ps_fma(auVar77,auVar234,auVar78);
  auVar263 = ZEXT1664(auVar79);
  auVar20._8_8_ = 0;
  auVar20._0_8_ = *(ulong *)(prim + ((ulong)(byte)PVar4 * 0x20 - uVar67) + 6);
  auVar78 = vpmovsxwd_avx(auVar20);
  auVar78 = vcvtdq2ps_avx(auVar78);
  local_430 = prim;
  auVar27._8_8_ = 0;
  auVar27._0_8_ = *(ulong *)(prim + uVar67 * 0x23 + 6);
  auVar77 = vpmovsxwd_avx(auVar27);
  auVar77 = vcvtdq2ps_avx(auVar77);
  auVar77 = vsubps_avx(auVar77,auVar78);
  auVar77 = vfmadd213ps_fma(auVar77,auVar234,auVar78);
  auVar78 = vsubps_avx(auVar71,auVar29);
  auVar235._0_4_ = auVar28._0_4_ * auVar78._0_4_;
  auVar235._4_4_ = auVar28._4_4_ * auVar78._4_4_;
  auVar235._8_4_ = auVar28._8_4_ * auVar78._8_4_;
  auVar235._12_4_ = auVar28._12_4_ * auVar78._12_4_;
  auVar78 = vsubps_avx(auVar81,auVar29);
  auVar179._0_4_ = auVar28._0_4_ * auVar78._0_4_;
  auVar179._4_4_ = auVar28._4_4_ * auVar78._4_4_;
  auVar179._8_4_ = auVar28._8_4_ * auVar78._8_4_;
  auVar179._12_4_ = auVar28._12_4_ * auVar78._12_4_;
  auVar78 = vsubps_avx(auVar236,auVar133);
  auVar226._0_4_ = auVar70._0_4_ * auVar78._0_4_;
  auVar226._4_4_ = auVar70._4_4_ * auVar78._4_4_;
  auVar226._8_4_ = auVar70._8_4_ * auVar78._8_4_;
  auVar226._12_4_ = auVar70._12_4_ * auVar78._12_4_;
  auVar78 = vsubps_avx(auVar72,auVar133);
  auVar158._0_4_ = auVar70._0_4_ * auVar78._0_4_;
  auVar158._4_4_ = auVar70._4_4_ * auVar78._4_4_;
  auVar158._8_4_ = auVar70._8_4_ * auVar78._8_4_;
  auVar158._12_4_ = auVar70._12_4_ * auVar78._12_4_;
  auVar78 = vsubps_avx(auVar79,auVar134);
  auVar219._0_4_ = auVar26._0_4_ * auVar78._0_4_;
  auVar219._4_4_ = auVar26._4_4_ * auVar78._4_4_;
  auVar219._8_4_ = auVar26._8_4_ * auVar78._8_4_;
  auVar219._12_4_ = auVar26._12_4_ * auVar78._12_4_;
  auVar78 = vsubps_avx(auVar77,auVar134);
  auVar134._0_4_ = auVar26._0_4_ * auVar78._0_4_;
  auVar134._4_4_ = auVar26._4_4_ * auVar78._4_4_;
  auVar134._8_4_ = auVar26._8_4_ * auVar78._8_4_;
  auVar134._12_4_ = auVar26._12_4_ * auVar78._12_4_;
  auVar78 = vpminsd_avx(auVar235,auVar179);
  auVar77 = vpminsd_avx(auVar226,auVar158);
  auVar78 = vmaxps_avx(auVar78,auVar77);
  auVar77 = vpminsd_avx(auVar219,auVar134);
  uVar132 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
  auVar28._4_4_ = uVar132;
  auVar28._0_4_ = uVar132;
  auVar28._8_4_ = uVar132;
  auVar28._12_4_ = uVar132;
  auVar77 = vmaxps_avx512vl(auVar77,auVar28);
  auVar78 = vmaxps_avx(auVar78,auVar77);
  auVar70._8_4_ = 0x3f7ffffa;
  auVar70._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar70._12_4_ = 0x3f7ffffa;
  local_340 = vmulps_avx512vl(auVar78,auVar70);
  auVar78 = vpmaxsd_avx(auVar235,auVar179);
  auVar77 = vpmaxsd_avx(auVar226,auVar158);
  auVar78 = vminps_avx(auVar78,auVar77);
  auVar77 = vpmaxsd_avx(auVar219,auVar134);
  fVar201 = ray->tfar;
  auVar26._4_4_ = fVar201;
  auVar26._0_4_ = fVar201;
  auVar26._8_4_ = fVar201;
  auVar26._12_4_ = fVar201;
  auVar77 = vminps_avx512vl(auVar77,auVar26);
  auVar78 = vminps_avx(auVar78,auVar77);
  auVar29._8_4_ = 0x3f800003;
  auVar29._0_8_ = 0x3f8000033f800003;
  auVar29._12_4_ = 0x3f800003;
  auVar78 = vmulps_avx512vl(auVar78,auVar29);
  auVar77 = vpbroadcastd_avx512vl();
  uVar21 = vcmpps_avx512vl(local_340,auVar78,2);
  uVar66 = vpcmpgtd_avx512vl(auVar77,_DAT_01f7fcf0);
  uVar66 = ((byte)uVar21 & 0xf) & uVar66;
  if ((char)uVar66 == '\0') {
    return false;
  }
LAB_01b9bb07:
  local_428 = uVar66;
  lVar62 = 0;
  for (; (uVar66 & 1) == 0; uVar66 = uVar66 >> 1 | 0x8000000000000000) {
    lVar62 = lVar62 + 1;
  }
  local_8e8 = (ulong)*(uint *)(local_430 + 2);
  pGVar5 = (context->scene->geometries).items[*(uint *)(local_430 + 2)].ptr;
  local_5a8 = (ulong)*(uint *)(local_430 + lVar62 * 4 + 6);
  uVar66 = (ulong)*(uint *)(*(long *)&pGVar5->field_0x58 +
                           (ulong)*(uint *)(local_430 + lVar62 * 4 + 6) *
                           pGVar5[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  fVar201 = (pGVar5->time_range).lower;
  fVar201 = pGVar5->fnumTimeSegments *
            (((ray->dir).field_0.m128[3] - fVar201) / ((pGVar5->time_range).upper - fVar201));
  auVar78 = vroundss_avx(ZEXT416((uint)fVar201),ZEXT416((uint)fVar201),9);
  auVar78 = vminss_avx(auVar78,ZEXT416((uint)(pGVar5->fnumTimeSegments + -1.0)));
  auVar78 = vmaxss_avx(ZEXT816(0) << 0x20,auVar78);
  fVar201 = fVar201 - auVar78._0_4_;
  _Var6 = pGVar5[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar64 = (long)(int)auVar78._0_4_ * 0x38;
  lVar62 = *(long *)(_Var6 + 0x10 + lVar64);
  lVar7 = *(long *)(_Var6 + 0x38 + lVar64);
  lVar8 = *(long *)(_Var6 + 0x48 + lVar64);
  pfVar1 = (float *)(lVar7 + uVar66 * lVar8);
  auVar180._0_4_ = fVar201 * *pfVar1;
  auVar180._4_4_ = fVar201 * pfVar1[1];
  auVar180._8_4_ = fVar201 * pfVar1[2];
  auVar180._12_4_ = fVar201 * pfVar1[3];
  pfVar1 = (float *)(lVar7 + (uVar66 + 1) * lVar8);
  auVar202._0_4_ = fVar201 * *pfVar1;
  auVar202._4_4_ = fVar201 * pfVar1[1];
  auVar202._8_4_ = fVar201 * pfVar1[2];
  auVar202._12_4_ = fVar201 * pfVar1[3];
  pfVar1 = (float *)(lVar7 + (uVar66 + 2) * lVar8);
  auVar220._0_4_ = fVar201 * *pfVar1;
  auVar220._4_4_ = fVar201 * pfVar1[1];
  auVar220._8_4_ = fVar201 * pfVar1[2];
  auVar220._12_4_ = fVar201 * pfVar1[3];
  pfVar1 = (float *)(lVar7 + lVar8 * (uVar66 + 3));
  auVar159._0_4_ = fVar201 * *pfVar1;
  auVar159._4_4_ = fVar201 * pfVar1[1];
  auVar159._8_4_ = fVar201 * pfVar1[2];
  auVar159._12_4_ = fVar201 * pfVar1[3];
  lVar7 = *(long *)(_Var6 + lVar64);
  fVar201 = 1.0 - fVar201;
  auVar135._4_4_ = fVar201;
  auVar135._0_4_ = fVar201;
  auVar135._8_4_ = fVar201;
  auVar135._12_4_ = fVar201;
  auVar71 = vfmadd231ps_fma(auVar180,auVar135,*(undefined1 (*) [16])(lVar7 + lVar62 * uVar66));
  auVar81 = vfmadd231ps_fma(auVar202,auVar135,*(undefined1 (*) [16])(lVar7 + lVar62 * (uVar66 + 1)))
  ;
  auVar236 = vfmadd231ps_fma(auVar220,auVar135,*(undefined1 (*) [16])(lVar7 + lVar62 * (uVar66 + 2))
                            );
  auVar72 = vfmadd231ps_fma(auVar159,auVar135,*(undefined1 (*) [16])(lVar7 + lVar62 * (uVar66 + 3)))
  ;
  auVar227._0_4_ = auVar71._0_4_ + auVar81._0_4_ + auVar236._0_4_ + auVar72._0_4_;
  auVar227._4_4_ = auVar71._4_4_ + auVar81._4_4_ + auVar236._4_4_ + auVar72._4_4_;
  auVar227._8_4_ = auVar71._8_4_ + auVar81._8_4_ + auVar236._8_4_ + auVar72._8_4_;
  auVar227._12_4_ = auVar71._12_4_ + auVar81._12_4_ + auVar236._12_4_ + auVar72._12_4_;
  aVar2 = (ray->org).field_0;
  aVar3 = (ray->dir).field_0.field_1;
  auVar30._8_4_ = 0x3e800000;
  auVar30._0_8_ = 0x3e8000003e800000;
  auVar30._12_4_ = 0x3e800000;
  auVar78 = vmulps_avx512vl(auVar227,auVar30);
  auVar78 = vsubps_avx(auVar78,(undefined1  [16])aVar2);
  auVar78 = vdpps_avx(auVar78,(undefined1  [16])aVar3,0x7f);
  auVar77 = vdpps_avx((undefined1  [16])aVar3,(undefined1  [16])aVar3,0x7f);
  auVar254 = ZEXT816(0) << 0x40;
  auVar256 = ZEXT1664(auVar254);
  auVar248._4_12_ = ZEXT812(0) << 0x20;
  auVar248._0_4_ = auVar77._0_4_;
  auVar79 = vrcp14ss_avx512f(auVar254,auVar248);
  auVar77 = vfnmadd213ss_fma(auVar79,auVar77,ZEXT416(0x40000000));
  fVar201 = auVar78._0_4_ * auVar79._0_4_ * auVar77._0_4_;
  local_490 = ZEXT416((uint)fVar201);
  auVar228._4_4_ = fVar201;
  auVar228._0_4_ = fVar201;
  auVar228._8_4_ = fVar201;
  auVar228._12_4_ = fVar201;
  fStack_8b0 = fVar201;
  _local_8c0 = auVar228;
  fStack_8ac = fVar201;
  fStack_8a8 = fVar201;
  fStack_8a4 = fVar201;
  auVar78 = vfmadd231ps_fma((undefined1  [16])aVar2,(undefined1  [16])aVar3,auVar228);
  auVar78 = vblendps_avx(auVar78,auVar254,8);
  auVar238 = ZEXT3264(CONCAT428(0x3f800000,
                                CONCAT424(0x3f800000,
                                          CONCAT420(0x3f800000,
                                                    CONCAT416(0x3f800000,
                                                              CONCAT412(0x3f800000,
                                                                        CONCAT48(0x3f800000,
                                                                                 0x3f8000003f800000)
                                                                       ))))));
  auVar77 = vsubps_avx(auVar71,auVar78);
  auVar245 = ZEXT1664(auVar77);
  auVar71 = vsubps_avx(auVar236,auVar78);
  uVar132 = *(undefined4 *)&(ray->dir).field_0;
  local_380._4_4_ = uVar132;
  local_380._0_4_ = uVar132;
  local_380._8_4_ = uVar132;
  local_380._12_4_ = uVar132;
  local_380._16_4_ = uVar132;
  local_380._20_4_ = uVar132;
  local_380._24_4_ = uVar132;
  local_380._28_4_ = uVar132;
  auVar253 = ZEXT3264(local_380);
  local_620 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->dir).field_0.m128[1]));
  auVar276 = ZEXT3264(local_620);
  local_3a0 = *(undefined4 *)((long)&(ray->dir).field_0 + 8);
  uStack_39c = local_3a0;
  uStack_398 = local_3a0;
  uStack_394 = local_3a0;
  uStack_390 = local_3a0;
  uStack_38c = local_3a0;
  uStack_388 = local_3a0;
  uStack_384 = local_3a0;
  auVar81 = vsubps_avx(auVar81,auVar78);
  auVar249 = ZEXT1664(auVar81);
  auVar78 = vsubps_avx(auVar72,auVar78);
  auVar232 = ZEXT1664(auVar78);
  local_7a0 = vbroadcastss_avx512vl(auVar77);
  auVar274 = ZEXT3264(local_7a0);
  auVar82._8_4_ = 1;
  auVar82._0_8_ = 0x100000001;
  auVar82._12_4_ = 1;
  auVar82._16_4_ = 1;
  auVar82._20_4_ = 1;
  auVar82._24_4_ = 1;
  auVar82._28_4_ = 1;
  local_500 = ZEXT1632(auVar77);
  local_7c0 = vpermps_avx512vl(auVar82,local_500);
  auVar268 = ZEXT3264(local_7c0);
  auVar83._8_4_ = 2;
  auVar83._0_8_ = 0x200000002;
  auVar83._12_4_ = 2;
  auVar83._16_4_ = 2;
  auVar83._20_4_ = 2;
  auVar83._24_4_ = 2;
  auVar83._28_4_ = 2;
  local_7e0 = vpermps_avx512vl(auVar83,local_500);
  auVar269 = ZEXT3264(local_7e0);
  auVar84._8_4_ = 3;
  auVar84._0_8_ = 0x300000003;
  auVar84._12_4_ = 3;
  auVar84._16_4_ = 3;
  auVar84._20_4_ = 3;
  auVar84._24_4_ = 3;
  auVar84._28_4_ = 3;
  local_680 = vpermps_avx512vl(auVar84,local_500);
  auVar270 = ZEXT3264(local_680);
  local_800 = vbroadcastss_avx512vl(auVar81);
  auVar271 = ZEXT3264(local_800);
  local_540 = ZEXT1632(auVar81);
  local_6a0 = vpermps_avx512vl(auVar82,local_540);
  auVar272 = ZEXT3264(local_6a0);
  local_820 = vpermps_avx512vl(auVar83,local_540);
  auVar273 = ZEXT3264(local_820);
  local_840 = vpermps_avx512vl(auVar84,local_540);
  auVar275 = ZEXT3264(local_840);
  local_6c0 = vbroadcastss_avx512vl(auVar71);
  auVar277 = ZEXT3264(local_6c0);
  local_520 = ZEXT1632(auVar71);
  local_6e0 = vpermps_avx512vl(auVar82,local_520);
  auVar278 = ZEXT3264(local_6e0);
  local_700 = vpermps_avx512vl(auVar83,local_520);
  auVar279 = ZEXT3264(local_700);
  local_780 = vpermps_avx512vl(auVar84,local_520);
  auVar280 = ZEXT3264(local_780);
  local_860 = vbroadcastss_avx512vl(auVar78);
  auVar281 = ZEXT3264(local_860);
  _local_560 = ZEXT1632(auVar78);
  _local_1e0 = vpermps_avx2(auVar82,_local_560);
  local_240 = vpermps_avx512vl(auVar83,_local_560);
  local_260 = vpermps_avx2(auVar84,_local_560);
  auVar92 = vpermps_avx2(auVar83,ZEXT1632(CONCAT412(aVar3.field_3.w * aVar3.field_3.w,
                                                    CONCAT48(aVar3.z * aVar3.z,
                                                             CONCAT44(aVar3.y * aVar3.y,
                                                                      aVar3.x * aVar3.x)))));
  local_220 = vfmadd231ps_avx512vl(auVar92,local_620,local_620);
  auVar78 = vfmadd231ps_fma(local_220,local_380,local_380);
  local_200 = ZEXT1632(auVar78);
  auVar92._8_4_ = 0x7fffffff;
  auVar92._0_8_ = 0x7fffffff7fffffff;
  auVar92._12_4_ = 0x7fffffff;
  auVar92._16_4_ = 0x7fffffff;
  auVar92._20_4_ = 0x7fffffff;
  auVar92._24_4_ = 0x7fffffff;
  auVar92._28_4_ = 0x7fffffff;
  vandps_avx512vl(ZEXT1632(auVar78),auVar92);
  local_864 = 1;
  uVar66 = 0;
  bVar63 = false;
  local_330 = ZEXT816(0x3f80000000000000);
  do {
    auVar78 = vmovshdup_avx(local_330);
    auVar78 = vsubps_avx(auVar78,local_330);
    auVar136._0_4_ = auVar78._0_4_;
    fVar19 = auVar136._0_4_ * 0.04761905;
    uVar132 = local_330._0_4_;
    local_600._4_4_ = uVar132;
    local_600._0_4_ = uVar132;
    local_600._8_4_ = uVar132;
    local_600._12_4_ = uVar132;
    local_600._16_4_ = uVar132;
    local_600._20_4_ = uVar132;
    local_600._24_4_ = uVar132;
    local_600._28_4_ = uVar132;
    auVar136._4_4_ = auVar136._0_4_;
    auVar136._8_4_ = auVar136._0_4_;
    auVar136._12_4_ = auVar136._0_4_;
    local_760._16_4_ = auVar136._0_4_;
    local_760._0_16_ = auVar136;
    local_760._20_4_ = auVar136._0_4_;
    local_760._24_4_ = auVar136._0_4_;
    local_760._28_4_ = auVar136._0_4_;
    auVar78 = vfmadd231ps_fma(local_600,local_760,_DAT_01faff20);
    auVar92 = vsubps_avx(auVar238._0_32_,ZEXT1632(auVar78));
    fVar246 = auVar92._0_4_;
    fVar251 = auVar92._4_4_;
    fVar216 = auVar92._8_4_;
    fVar266 = auVar92._12_4_;
    fVar176 = auVar92._16_4_;
    fVar17 = auVar92._20_4_;
    fVar18 = auVar92._24_4_;
    fVar131 = fVar246 * fVar246 * fVar246;
    fVar151 = fVar251 * fVar251 * fVar251;
    auVar85._4_4_ = fVar151;
    auVar85._0_4_ = fVar131;
    fVar152 = fVar216 * fVar216 * fVar216;
    auVar85._8_4_ = fVar152;
    fVar153 = fVar266 * fVar266 * fVar266;
    auVar85._12_4_ = fVar153;
    fVar154 = fVar176 * fVar176 * fVar176;
    auVar85._16_4_ = fVar154;
    fVar155 = fVar17 * fVar17 * fVar17;
    auVar85._20_4_ = fVar155;
    fVar156 = fVar18 * fVar18 * fVar18;
    auVar85._24_4_ = fVar156;
    auVar85._28_4_ = auVar136._0_4_;
    auVar82 = vbroadcastss_avx512vl(ZEXT416(0x40800000));
    auVar83 = vmulps_avx512vl(auVar85,auVar82);
    fVar250 = auVar78._0_4_;
    fVar252 = auVar78._4_4_;
    fVar217 = auVar78._8_4_;
    fVar267 = auVar78._12_4_;
    fVar175 = fVar250 * fVar250 * fVar250;
    fVar198 = fVar252 * fVar252 * fVar252;
    fVar199 = fVar217 * fVar217 * fVar217;
    fVar200 = fVar267 * fVar267 * fVar267;
    auVar238._0_4_ = fVar250 * fVar246;
    auVar238._4_4_ = fVar252 * fVar251;
    auVar238._8_4_ = fVar217 * fVar216;
    auVar238._12_4_ = fVar267 * fVar266;
    auVar238._16_4_ = fVar176 * 0.0;
    auVar238._20_4_ = fVar17 * 0.0;
    auVar238._28_36_ = auVar253._28_36_;
    auVar238._24_4_ = fVar18 * 0.0;
    fVar201 = auVar263._28_4_;
    auVar84 = vmulps_avx512vl(ZEXT1632(CONCAT412(fVar200,CONCAT48(fVar199,CONCAT44(fVar198,fVar175))
                                                )),auVar82);
    fVar257 = auVar84._28_4_ + auVar136._0_4_;
    fVar233 = fVar257 + auVar260._28_4_ + auVar232._28_4_;
    auVar91._4_4_ = fVar151 * 0.16666667;
    auVar91._0_4_ = fVar131 * 0.16666667;
    auVar91._8_4_ = fVar152 * 0.16666667;
    auVar91._12_4_ = fVar153 * 0.16666667;
    auVar91._16_4_ = fVar154 * 0.16666667;
    auVar91._20_4_ = fVar155 * 0.16666667;
    auVar91._24_4_ = fVar156 * 0.16666667;
    auVar91._28_4_ = fVar257;
    auVar87._4_4_ =
         (auVar238._4_4_ * fVar251 * 12.0 + auVar238._4_4_ * fVar252 * 6.0 + fVar198 + auVar83._4_4_
         ) * 0.16666667;
    auVar87._0_4_ =
         (auVar238._0_4_ * fVar246 * 12.0 + auVar238._0_4_ * fVar250 * 6.0 + fVar175 + auVar83._0_4_
         ) * 0.16666667;
    auVar87._8_4_ =
         (auVar238._8_4_ * fVar216 * 12.0 + auVar238._8_4_ * fVar217 * 6.0 + fVar199 + auVar83._8_4_
         ) * 0.16666667;
    auVar87._12_4_ =
         (auVar238._12_4_ * fVar266 * 12.0 + auVar238._12_4_ * fVar267 * 6.0 +
         fVar200 + auVar83._12_4_) * 0.16666667;
    auVar87._16_4_ =
         (auVar238._16_4_ * fVar176 * 12.0 + auVar238._16_4_ * 0.0 * 6.0 + auVar83._16_4_ + 0.0) *
         0.16666667;
    auVar87._20_4_ =
         (auVar238._20_4_ * fVar17 * 12.0 + auVar238._20_4_ * 0.0 * 6.0 + auVar83._20_4_ + 0.0) *
         0.16666667;
    auVar87._24_4_ =
         (auVar238._24_4_ * fVar18 * 12.0 + auVar238._24_4_ * 0.0 * 6.0 + auVar83._24_4_ + 0.0) *
         0.16666667;
    auVar87._28_4_ = auVar260._28_4_;
    auVar88._4_4_ =
         (auVar84._4_4_ + fVar151 + auVar238._4_4_ * fVar252 * 12.0 + auVar238._4_4_ * fVar251 * 6.0
         ) * 0.16666667;
    auVar88._0_4_ =
         (auVar84._0_4_ + fVar131 + auVar238._0_4_ * fVar250 * 12.0 + auVar238._0_4_ * fVar246 * 6.0
         ) * 0.16666667;
    auVar88._8_4_ =
         (auVar84._8_4_ + fVar152 + auVar238._8_4_ * fVar217 * 12.0 + auVar238._8_4_ * fVar216 * 6.0
         ) * 0.16666667;
    auVar88._12_4_ =
         (auVar84._12_4_ + fVar153 +
         auVar238._12_4_ * fVar267 * 12.0 + auVar238._12_4_ * fVar266 * 6.0) * 0.16666667;
    auVar88._16_4_ =
         (auVar84._16_4_ + fVar154 + auVar238._16_4_ * 0.0 * 12.0 + auVar238._16_4_ * fVar176 * 6.0)
         * 0.16666667;
    auVar88._20_4_ =
         (auVar84._20_4_ + fVar155 + auVar238._20_4_ * 0.0 * 12.0 + auVar238._20_4_ * fVar17 * 6.0)
         * 0.16666667;
    auVar88._24_4_ =
         (auVar84._24_4_ + fVar156 + auVar238._24_4_ * 0.0 * 12.0 + auVar238._24_4_ * fVar18 * 6.0)
         * 0.16666667;
    auVar88._28_4_ = fVar201;
    fVar175 = fVar175 * 0.16666667;
    fVar198 = fVar198 * 0.16666667;
    fVar199 = fVar199 * 0.16666667;
    fVar200 = fVar200 * 0.16666667;
    auVar89._28_4_ = fVar233;
    auVar89._0_28_ = ZEXT1628(CONCAT412(fVar200,CONCAT48(fVar199,CONCAT44(fVar198,fVar175))));
    auVar84 = vmulps_avx512vl(auVar281._0_32_,auVar89);
    auVar90._4_4_ = (float)local_1e0._4_4_ * fVar198;
    auVar90._0_4_ = (float)local_1e0._0_4_ * fVar175;
    auVar90._8_4_ = fStack_1d8 * fVar199;
    auVar90._12_4_ = fStack_1d4 * fVar200;
    auVar90._16_4_ = fStack_1d0 * 0.0;
    auVar90._20_4_ = fStack_1cc * 0.0;
    auVar90._24_4_ = fStack_1c8 * 0.0;
    auVar90._28_4_ = auVar256._28_4_ + fVar201 + auVar83._28_4_ + 0.0;
    auVar83 = vmulps_avx512vl(local_240,auVar89);
    auVar93._4_4_ = local_260._4_4_ * fVar198;
    auVar93._0_4_ = local_260._0_4_ * fVar175;
    auVar93._8_4_ = local_260._8_4_ * fVar199;
    auVar93._12_4_ = local_260._12_4_ * fVar200;
    auVar93._16_4_ = local_260._16_4_ * 0.0;
    auVar93._20_4_ = local_260._20_4_ * 0.0;
    auVar93._24_4_ = local_260._24_4_ * 0.0;
    auVar93._28_4_ = fVar233;
    auVar84 = vfmadd231ps_avx512vl(auVar84,auVar88,auVar277._0_32_);
    auVar85 = vfmadd231ps_avx512vl(auVar90,auVar88,auVar278._0_32_);
    auVar83 = vfmadd231ps_avx512vl(auVar83,auVar88,auVar279._0_32_);
    auVar86 = vfmadd231ps_avx512vl(auVar93,auVar280._0_32_,auVar88);
    auVar84 = vfmadd231ps_avx512vl(auVar84,auVar87,auVar271._0_32_);
    auVar85 = vfmadd231ps_avx512vl(auVar85,auVar87,auVar272._0_32_);
    auVar83 = vfmadd231ps_avx512vl(auVar83,auVar87,auVar273._0_32_);
    auVar86 = vfmadd231ps_avx512vl(auVar86,auVar275._0_32_,auVar87);
    auVar87 = vfmadd231ps_avx512vl(auVar84,auVar91,auVar274._0_32_);
    auVar88 = vfmadd231ps_avx512vl(auVar85,auVar91,auVar268._0_32_);
    auVar89 = vfmadd231ps_avx512vl(auVar83,auVar91,auVar269._0_32_);
    auVar83 = vfmadd231ps_avx512vl(auVar86,auVar270._0_32_,auVar91);
    auVar90 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
    auVar84 = vxorps_avx512vl(auVar92,auVar90);
    auVar85 = vxorps_avx512vl(ZEXT1632(auVar78),auVar90);
    auVar223._0_4_ = auVar85._0_4_ * fVar250;
    auVar223._4_4_ = auVar85._4_4_ * fVar252;
    auVar223._8_4_ = auVar85._8_4_ * fVar217;
    auVar223._12_4_ = auVar85._12_4_ * fVar267;
    auVar223._16_4_ = auVar85._16_4_ * 0.0;
    auVar223._20_4_ = auVar85._20_4_ * 0.0;
    auVar223._24_4_ = auVar85._24_4_ * 0.0;
    auVar223._28_4_ = 0;
    auVar91 = vmulps_avx512vl(auVar238._0_32_,auVar82);
    auVar82 = vsubps_avx(auVar223,auVar91);
    auVar94._4_4_ = auVar84._4_4_ * fVar251 * 0.5;
    auVar94._0_4_ = auVar84._0_4_ * fVar246 * 0.5;
    auVar94._8_4_ = auVar84._8_4_ * fVar216 * 0.5;
    auVar94._12_4_ = auVar84._12_4_ * fVar266 * 0.5;
    auVar94._16_4_ = auVar84._16_4_ * fVar176 * 0.5;
    auVar94._20_4_ = auVar84._20_4_ * fVar17 * 0.5;
    auVar94._24_4_ = auVar84._24_4_ * fVar18 * 0.5;
    auVar94._28_4_ = auVar92._28_4_;
    auVar95._4_4_ = auVar82._4_4_ * 0.5;
    auVar95._0_4_ = auVar82._0_4_ * 0.5;
    auVar95._8_4_ = auVar82._8_4_ * 0.5;
    auVar95._12_4_ = auVar82._12_4_ * 0.5;
    auVar95._16_4_ = auVar82._16_4_ * 0.5;
    auVar95._20_4_ = auVar82._20_4_ * 0.5;
    auVar95._24_4_ = auVar82._24_4_ * 0.5;
    auVar95._28_4_ = auVar82._28_4_;
    auVar96._4_4_ = (auVar91._4_4_ + fVar251 * fVar251) * 0.5;
    auVar96._0_4_ = (auVar91._0_4_ + fVar246 * fVar246) * 0.5;
    auVar96._8_4_ = (auVar91._8_4_ + fVar216 * fVar216) * 0.5;
    auVar96._12_4_ = (auVar91._12_4_ + fVar266 * fVar266) * 0.5;
    auVar96._16_4_ = (auVar91._16_4_ + fVar176 * fVar176) * 0.5;
    auVar96._20_4_ = (auVar91._20_4_ + fVar17 * fVar17) * 0.5;
    auVar96._24_4_ = (auVar91._24_4_ + fVar18 * fVar18) * 0.5;
    auVar96._28_4_ = auVar91._28_4_ + auVar245._28_4_;
    fVar246 = fVar250 * fVar250 * 0.5;
    fVar250 = fVar252 * fVar252 * 0.5;
    fVar251 = fVar217 * fVar217 * 0.5;
    fVar252 = fVar267 * fVar267 * 0.5;
    auVar97._28_4_ = auVar249._28_4_;
    auVar97._0_28_ = ZEXT1628(CONCAT412(fVar252,CONCAT48(fVar251,CONCAT44(fVar250,fVar246))));
    auVar98._4_4_ = auVar281._4_4_ * fVar250;
    auVar98._0_4_ = auVar281._0_4_ * fVar246;
    auVar98._8_4_ = auVar281._8_4_ * fVar251;
    auVar98._12_4_ = auVar281._12_4_ * fVar252;
    auVar98._16_4_ = auVar281._16_4_ * 0.0;
    auVar98._20_4_ = auVar281._20_4_ * 0.0;
    auVar98._24_4_ = auVar281._24_4_ * 0.0;
    auVar98._28_4_ = 0x3f000000;
    auVar104._4_4_ = (float)local_1e0._4_4_ * fVar250;
    auVar104._0_4_ = (float)local_1e0._0_4_ * fVar246;
    auVar104._8_4_ = fStack_1d8 * fVar251;
    auVar104._12_4_ = fStack_1d4 * fVar252;
    auVar104._16_4_ = fStack_1d0 * 0.0;
    auVar104._20_4_ = fStack_1cc * 0.0;
    auVar104._24_4_ = fStack_1c8 * 0.0;
    auVar104._28_4_ = auVar85._28_4_;
    auVar92 = vmulps_avx512vl(local_240,auVar97);
    auVar105._4_4_ = fVar250 * local_260._4_4_;
    auVar105._0_4_ = fVar246 * local_260._0_4_;
    auVar105._8_4_ = fVar251 * local_260._8_4_;
    auVar105._12_4_ = fVar252 * local_260._12_4_;
    auVar105._16_4_ = local_260._16_4_ * 0.0;
    auVar105._20_4_ = local_260._20_4_ * 0.0;
    auVar105._24_4_ = local_260._24_4_ * 0.0;
    auVar105._28_4_ = auVar249._28_4_;
    auVar82 = vfmadd231ps_avx512vl(auVar98,auVar96,auVar277._0_32_);
    auVar84 = vfmadd231ps_avx512vl(auVar104,auVar96,auVar278._0_32_);
    auVar92 = vfmadd231ps_avx512vl(auVar92,auVar96,auVar279._0_32_);
    auVar85 = vfmadd231ps_avx512vl(auVar105,auVar280._0_32_,auVar96);
    auVar82 = vfmadd231ps_avx512vl(auVar82,auVar95,auVar271._0_32_);
    auVar84 = vfmadd231ps_avx512vl(auVar84,auVar95,auVar272._0_32_);
    auVar92 = vfmadd231ps_avx512vl(auVar92,auVar95,auVar273._0_32_);
    auVar85 = vfmadd231ps_avx512vl(auVar85,auVar275._0_32_,auVar95);
    auVar82 = vfmadd231ps_avx512vl(auVar82,auVar94,auVar274._0_32_);
    auVar84 = vfmadd231ps_avx512vl(auVar84,auVar94,auVar268._0_32_);
    auVar92 = vfmadd231ps_avx512vl(auVar92,auVar94,auVar269._0_32_);
    auVar85 = vfmadd231ps_avx512vl(auVar85,auVar270._0_32_,auVar94);
    auVar111._4_4_ = auVar82._4_4_ * fVar19;
    auVar111._0_4_ = auVar82._0_4_ * fVar19;
    auVar111._8_4_ = auVar82._8_4_ * fVar19;
    auVar111._12_4_ = auVar82._12_4_ * fVar19;
    auVar111._16_4_ = auVar82._16_4_ * fVar19;
    auVar111._20_4_ = auVar82._20_4_ * fVar19;
    auVar111._24_4_ = auVar82._24_4_ * fVar19;
    auVar111._28_4_ = auVar281._28_4_;
    auVar260 = ZEXT3264(auVar111);
    auVar112._4_4_ = auVar84._4_4_ * fVar19;
    auVar112._0_4_ = auVar84._0_4_ * fVar19;
    auVar112._8_4_ = auVar84._8_4_ * fVar19;
    auVar112._12_4_ = auVar84._12_4_ * fVar19;
    auVar112._16_4_ = auVar84._16_4_ * fVar19;
    auVar112._20_4_ = auVar84._20_4_ * fVar19;
    auVar112._24_4_ = auVar84._24_4_ * fVar19;
    auVar112._28_4_ = fVar201;
    auVar263 = ZEXT3264(auVar112);
    auVar113._4_4_ = auVar92._4_4_ * fVar19;
    auVar113._0_4_ = auVar92._0_4_ * fVar19;
    auVar113._8_4_ = auVar92._8_4_ * fVar19;
    auVar113._12_4_ = auVar92._12_4_ * fVar19;
    auVar113._16_4_ = auVar92._16_4_ * fVar19;
    auVar113._20_4_ = auVar92._20_4_ * fVar19;
    auVar113._24_4_ = auVar92._24_4_ * fVar19;
    auVar113._28_4_ = auVar92._28_4_;
    fVar201 = auVar85._0_4_ * fVar19;
    fVar246 = auVar85._4_4_ * fVar19;
    auVar106._4_4_ = fVar246;
    auVar106._0_4_ = fVar201;
    fVar250 = auVar85._8_4_ * fVar19;
    auVar106._8_4_ = fVar250;
    fVar251 = auVar85._12_4_ * fVar19;
    auVar106._12_4_ = fVar251;
    fVar252 = auVar85._16_4_ * fVar19;
    auVar106._16_4_ = fVar252;
    fVar216 = auVar85._20_4_ * fVar19;
    auVar106._20_4_ = fVar216;
    fVar217 = auVar85._24_4_ * fVar19;
    auVar106._24_4_ = fVar217;
    auVar106._28_4_ = fVar19;
    auVar78 = vxorps_avx512vl(auVar280._0_16_,auVar280._0_16_);
    auVar93 = vpermt2ps_avx512vl(auVar87,_DAT_01feed00,ZEXT1632(auVar78));
    auVar249 = ZEXT3264(auVar93);
    auVar94 = vpermt2ps_avx512vl(auVar88,_DAT_01feed00,ZEXT1632(auVar78));
    auVar253 = ZEXT3264(auVar94);
    auVar84 = ZEXT1632(auVar78);
    auVar95 = vpermt2ps_avx512vl(auVar89,_DAT_01feed00,auVar84);
    auVar256 = ZEXT3264(auVar95);
    auVar224._0_4_ = fVar201 + auVar83._0_4_;
    auVar224._4_4_ = fVar246 + auVar83._4_4_;
    auVar224._8_4_ = fVar250 + auVar83._8_4_;
    auVar224._12_4_ = fVar251 + auVar83._12_4_;
    auVar224._16_4_ = fVar252 + auVar83._16_4_;
    auVar224._20_4_ = fVar216 + auVar83._20_4_;
    auVar224._24_4_ = fVar217 + auVar83._24_4_;
    auVar224._28_4_ = fVar19 + auVar83._28_4_;
    auVar92 = vmaxps_avx(auVar83,auVar224);
    auVar82 = vminps_avx(auVar83,auVar224);
    auVar86 = vpermt2ps_avx512vl(auVar83,_DAT_01feed00,auVar84);
    auVar96 = vpermt2ps_avx512vl(auVar111,_DAT_01feed00,auVar84);
    auVar97 = vpermt2ps_avx512vl(auVar112,_DAT_01feed00,auVar84);
    auVar223 = ZEXT1632(auVar78);
    auVar98 = vpermt2ps_avx512vl(auVar113,_DAT_01feed00,auVar223);
    auVar83 = vpermt2ps_avx512vl(auVar106,_DAT_01feed00,auVar223);
    auVar83 = vsubps_avx(auVar86,auVar83);
    auVar84 = vsubps_avx(auVar93,auVar87);
    auVar85 = vsubps_avx(auVar94,auVar88);
    auVar91 = vsubps_avx(auVar95,auVar89);
    auVar232 = ZEXT3264(auVar91);
    auVar99 = vmulps_avx512vl(auVar85,auVar113);
    auVar99 = vfmsub231ps_avx512vl(auVar99,auVar112,auVar91);
    auVar100 = vmulps_avx512vl(auVar91,auVar111);
    auVar100 = vfmsub231ps_avx512vl(auVar100,auVar113,auVar84);
    auVar101 = vmulps_avx512vl(auVar84,auVar112);
    auVar101 = vfmsub231ps_avx512vl(auVar101,auVar111,auVar85);
    auVar101 = vmulps_avx512vl(auVar101,auVar101);
    auVar100 = vfmadd231ps_avx512vl(auVar101,auVar100,auVar100);
    auVar99 = vfmadd231ps_avx512vl(auVar100,auVar99,auVar99);
    auVar100 = vmulps_avx512vl(auVar91,auVar91);
    auVar100 = vfmadd231ps_avx512vl(auVar100,auVar85,auVar85);
    auVar101 = vfmadd231ps_avx512vl(auVar100,auVar84,auVar84);
    auVar100 = vrcp14ps_avx512vl(auVar101);
    auVar102 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    auVar103 = vfnmadd213ps_avx512vl(auVar100,auVar101,auVar102);
    auVar100 = vfmadd132ps_avx512vl(auVar103,auVar100,auVar100);
    auVar99 = vmulps_avx512vl(auVar99,auVar100);
    auVar103 = vmulps_avx512vl(auVar85,auVar98);
    auVar103 = vfmsub231ps_avx512vl(auVar103,auVar97,auVar91);
    auVar104 = vmulps_avx512vl(auVar91,auVar96);
    auVar104 = vfmsub231ps_avx512vl(auVar104,auVar98,auVar84);
    auVar105 = vmulps_avx512vl(auVar84,auVar97);
    auVar105 = vfmsub231ps_avx512vl(auVar105,auVar96,auVar85);
    auVar105 = vmulps_avx512vl(auVar105,auVar105);
    auVar104 = vfmadd231ps_avx512vl(auVar105,auVar104,auVar104);
    auVar103 = vfmadd231ps_avx512vl(auVar104,auVar103,auVar103);
    auVar100 = vmulps_avx512vl(auVar103,auVar100);
    auVar99 = vmaxps_avx512vl(auVar99,auVar100);
    auVar99 = vsqrtps_avx512vl(auVar99);
    auVar100 = vmaxps_avx512vl(auVar83,auVar86);
    auVar92 = vmaxps_avx512vl(auVar92,auVar100);
    auVar103 = vaddps_avx512vl(auVar99,auVar92);
    auVar92 = vminps_avx(auVar83,auVar86);
    auVar92 = vminps_avx(auVar82,auVar92);
    auVar92 = vsubps_avx512vl(auVar92,auVar99);
    auVar86._8_4_ = 0x3f800002;
    auVar86._0_8_ = 0x3f8000023f800002;
    auVar86._12_4_ = 0x3f800002;
    auVar86._16_4_ = 0x3f800002;
    auVar86._20_4_ = 0x3f800002;
    auVar86._24_4_ = 0x3f800002;
    auVar86._28_4_ = 0x3f800002;
    auVar82 = vmulps_avx512vl(auVar103,auVar86);
    auVar99._8_4_ = 0x3f7ffffc;
    auVar99._0_8_ = 0x3f7ffffc3f7ffffc;
    auVar99._12_4_ = 0x3f7ffffc;
    auVar99._16_4_ = 0x3f7ffffc;
    auVar99._20_4_ = 0x3f7ffffc;
    auVar99._24_4_ = 0x3f7ffffc;
    auVar99._28_4_ = 0x3f7ffffc;
    local_8e0 = vmulps_avx512vl(auVar92,auVar99);
    auVar92 = vmulps_avx512vl(auVar82,auVar82);
    auVar82 = vrsqrt14ps_avx512vl(auVar101);
    auVar100._8_4_ = 0xbf000000;
    auVar100._0_8_ = 0xbf000000bf000000;
    auVar100._12_4_ = 0xbf000000;
    auVar100._16_4_ = 0xbf000000;
    auVar100._20_4_ = 0xbf000000;
    auVar100._24_4_ = 0xbf000000;
    auVar100._28_4_ = 0xbf000000;
    auVar83 = vmulps_avx512vl(auVar101,auVar100);
    fVar201 = auVar82._0_4_;
    fVar246 = auVar82._4_4_;
    fVar250 = auVar82._8_4_;
    fVar251 = auVar82._12_4_;
    fVar252 = auVar82._16_4_;
    fVar216 = auVar82._20_4_;
    fVar217 = auVar82._24_4_;
    auVar107._4_4_ = fVar246 * fVar246 * fVar246 * auVar83._4_4_;
    auVar107._0_4_ = fVar201 * fVar201 * fVar201 * auVar83._0_4_;
    auVar107._8_4_ = fVar250 * fVar250 * fVar250 * auVar83._8_4_;
    auVar107._12_4_ = fVar251 * fVar251 * fVar251 * auVar83._12_4_;
    auVar107._16_4_ = fVar252 * fVar252 * fVar252 * auVar83._16_4_;
    auVar107._20_4_ = fVar216 * fVar216 * fVar216 * auVar83._20_4_;
    auVar107._24_4_ = fVar217 * fVar217 * fVar217 * auVar83._24_4_;
    auVar107._28_4_ = auVar103._28_4_;
    auVar101._8_4_ = 0x3fc00000;
    auVar101._0_8_ = 0x3fc000003fc00000;
    auVar101._12_4_ = 0x3fc00000;
    auVar101._16_4_ = 0x3fc00000;
    auVar101._20_4_ = 0x3fc00000;
    auVar101._24_4_ = 0x3fc00000;
    auVar101._28_4_ = 0x3fc00000;
    auVar82 = vfmadd231ps_avx512vl(auVar107,auVar82,auVar101);
    auVar83 = vmulps_avx512vl(auVar84,auVar82);
    auVar86 = vmulps_avx512vl(auVar85,auVar82);
    auVar99 = vmulps_avx512vl(auVar91,auVar82);
    auVar100 = vsubps_avx512vl(auVar223,auVar87);
    auVar101 = vsubps_avx512vl(auVar223,auVar88);
    auVar104 = vsubps_avx512vl(auVar223,auVar89);
    auVar108._4_4_ = uStack_39c;
    auVar108._0_4_ = local_3a0;
    auVar108._8_4_ = uStack_398;
    auVar108._12_4_ = uStack_394;
    auVar108._16_4_ = uStack_390;
    auVar108._20_4_ = uStack_38c;
    auVar108._24_4_ = uStack_388;
    auVar108._28_4_ = uStack_384;
    auVar103 = vmulps_avx512vl(auVar108,auVar104);
    auVar103 = vfmadd231ps_avx512vl(auVar103,auVar276._0_32_,auVar101);
    auVar103 = vfmadd231ps_avx512vl(auVar103,local_380,auVar100);
    auVar105 = vmulps_avx512vl(auVar104,auVar104);
    auVar105 = vfmadd231ps_avx512vl(auVar105,auVar101,auVar101);
    auVar105 = vfmadd231ps_avx512vl(auVar105,auVar100,auVar100);
    auVar106 = vmulps_avx512vl(auVar108,auVar99);
    auVar106 = vfmadd231ps_avx512vl(auVar106,auVar86,auVar276._0_32_);
    auVar106 = vfmadd231ps_avx512vl(auVar106,auVar83,local_380);
    auVar99 = vmulps_avx512vl(auVar104,auVar99);
    auVar86 = vfmadd231ps_avx512vl(auVar99,auVar101,auVar86);
    auVar83 = vfmadd231ps_avx512vl(auVar86,auVar100,auVar83);
    auVar86 = vmulps_avx512vl(auVar106,auVar106);
    auVar99 = vsubps_avx512vl(local_200,auVar86);
    auVar107 = vmulps_avx512vl(auVar106,auVar83);
    auVar103 = vsubps_avx512vl(auVar103,auVar107);
    auVar107 = vaddps_avx512vl(auVar103,auVar103);
    auVar103 = vmulps_avx512vl(auVar83,auVar83);
    local_580 = vsubps_avx512vl(auVar105,auVar103);
    auVar92 = vsubps_avx512vl(local_580,auVar92);
    local_4c0 = vmulps_avx512vl(auVar107,auVar107);
    auVar103._8_4_ = 0x40800000;
    auVar103._0_8_ = 0x4080000040800000;
    auVar103._12_4_ = 0x40800000;
    auVar103._16_4_ = 0x40800000;
    auVar103._20_4_ = 0x40800000;
    auVar103._24_4_ = 0x40800000;
    auVar103._28_4_ = 0x40800000;
    _local_4e0 = vmulps_avx512vl(auVar99,auVar103);
    auVar103 = vmulps_avx512vl(_local_4e0,auVar92);
    auVar103 = vsubps_avx512vl(local_4c0,auVar103);
    uVar67 = vcmpps_avx512vl(auVar103,auVar223,5);
    bVar58 = (byte)uVar67;
    if (bVar58 == 0) {
LAB_01b9c8f0:
      auVar276 = ZEXT3264(local_620);
      auVar280 = ZEXT3264(local_780);
      auVar279 = ZEXT3264(local_700);
      auVar278 = ZEXT3264(local_6e0);
      auVar277 = ZEXT3264(local_6c0);
      auVar275 = ZEXT3264(local_840);
      auVar274 = ZEXT3264(local_7a0);
      auVar273 = ZEXT3264(local_820);
      auVar272 = ZEXT3264(local_6a0);
      auVar271 = ZEXT3264(local_800);
      auVar270 = ZEXT3264(local_680);
      auVar269 = ZEXT3264(local_7e0);
      auVar268 = ZEXT3264(local_7c0);
      auVar245 = ZEXT3264(_local_8c0);
      auVar238 = ZEXT3264(auVar102);
      auVar281 = ZEXT3264(local_860);
    }
    else {
      auVar105 = _local_4e0;
      auVar103 = vsqrtps_avx512vl(auVar103);
      auVar108 = vaddps_avx512vl(auVar99,auVar99);
      local_3e0 = vrcp14ps_avx512vl(auVar108);
      auVar102 = vfnmadd213ps_avx512vl(local_3e0,auVar108,auVar102);
      auVar102 = vfmadd132ps_avx512vl(auVar102,local_3e0,local_3e0);
      local_660 = vxorps_avx512vl(auVar107,auVar90);
      auVar90 = vsubps_avx512vl(local_660,auVar103);
      auVar90 = vmulps_avx512vl(auVar90,auVar102);
      auVar103 = vsubps_avx512vl(auVar103,auVar107);
      local_640 = vmulps_avx512vl(auVar103,auVar102);
      auVar103 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar103 = vblendmps_avx512vl(auVar103,auVar90);
      auVar109._0_4_ =
           (uint)(bVar58 & 1) * auVar103._0_4_ | (uint)!(bool)(bVar58 & 1) * auVar102._0_4_;
      bVar65 = (bool)((byte)(uVar67 >> 1) & 1);
      auVar109._4_4_ = (uint)bVar65 * auVar103._4_4_ | (uint)!bVar65 * auVar102._4_4_;
      bVar65 = (bool)((byte)(uVar67 >> 2) & 1);
      auVar109._8_4_ = (uint)bVar65 * auVar103._8_4_ | (uint)!bVar65 * auVar102._8_4_;
      bVar65 = (bool)((byte)(uVar67 >> 3) & 1);
      auVar109._12_4_ = (uint)bVar65 * auVar103._12_4_ | (uint)!bVar65 * auVar102._12_4_;
      bVar65 = (bool)((byte)(uVar67 >> 4) & 1);
      auVar109._16_4_ = (uint)bVar65 * auVar103._16_4_ | (uint)!bVar65 * auVar102._16_4_;
      bVar65 = (bool)((byte)(uVar67 >> 5) & 1);
      auVar109._20_4_ = (uint)bVar65 * auVar103._20_4_ | (uint)!bVar65 * auVar102._20_4_;
      bVar65 = (bool)((byte)(uVar67 >> 6) & 1);
      auVar109._24_4_ = (uint)bVar65 * auVar103._24_4_ | (uint)!bVar65 * auVar102._24_4_;
      bVar65 = SUB81(uVar67 >> 7,0);
      auVar109._28_4_ = (uint)bVar65 * auVar103._28_4_ | (uint)!bVar65 * auVar102._28_4_;
      auVar103 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar102 = vblendmps_avx512vl(auVar103,local_640);
      auVar110._0_4_ =
           (uint)(bVar58 & 1) * auVar102._0_4_ | (uint)!(bool)(bVar58 & 1) * auVar103._0_4_;
      bVar65 = (bool)((byte)(uVar67 >> 1) & 1);
      auVar110._4_4_ = (uint)bVar65 * auVar102._4_4_ | (uint)!bVar65 * auVar103._4_4_;
      bVar65 = (bool)((byte)(uVar67 >> 2) & 1);
      auVar110._8_4_ = (uint)bVar65 * auVar102._8_4_ | (uint)!bVar65 * auVar103._8_4_;
      bVar65 = (bool)((byte)(uVar67 >> 3) & 1);
      auVar110._12_4_ = (uint)bVar65 * auVar102._12_4_ | (uint)!bVar65 * auVar103._12_4_;
      bVar65 = (bool)((byte)(uVar67 >> 4) & 1);
      auVar110._16_4_ = (uint)bVar65 * auVar102._16_4_ | (uint)!bVar65 * auVar103._16_4_;
      bVar65 = (bool)((byte)(uVar67 >> 5) & 1);
      auVar110._20_4_ = (uint)bVar65 * auVar102._20_4_ | (uint)!bVar65 * auVar103._20_4_;
      bVar65 = (bool)((byte)(uVar67 >> 6) & 1);
      auVar110._24_4_ = (uint)bVar65 * auVar102._24_4_ | (uint)!bVar65 * auVar103._24_4_;
      bVar65 = SUB81(uVar67 >> 7,0);
      auVar110._28_4_ = (uint)bVar65 * auVar102._28_4_ | (uint)!bVar65 * auVar103._28_4_;
      auVar103 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar86,auVar103);
      _local_400 = vmaxps_avx512vl(local_220,auVar103);
      auVar37._8_4_ = 0x36000000;
      auVar37._0_8_ = 0x3600000036000000;
      auVar37._12_4_ = 0x36000000;
      auVar37._16_4_ = 0x36000000;
      auVar37._20_4_ = 0x36000000;
      auVar37._24_4_ = 0x36000000;
      auVar37._28_4_ = 0x36000000;
      local_420 = vmulps_avx512vl(_local_400,auVar37);
      vandps_avx512vl(auVar99,auVar103);
      uVar68 = vcmpps_avx512vl(local_420,local_420,1);
      uVar67 = uVar67 & uVar68;
      bVar61 = (byte)uVar67;
      if (bVar61 != 0) {
        uVar68 = vcmpps_avx512vl(auVar92,_DAT_01faff00,2);
        auVar92 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar86 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
        auVar99 = vblendmps_avx512vl(auVar92,auVar86);
        bVar60 = (byte)uVar68;
        uVar69 = (uint)(bVar60 & 1) * auVar99._0_4_ | (uint)!(bool)(bVar60 & 1) * auVar92._0_4_;
        bVar65 = (bool)((byte)(uVar68 >> 1) & 1);
        uVar124 = (uint)bVar65 * auVar99._4_4_ | (uint)!bVar65 * auVar92._4_4_;
        bVar65 = (bool)((byte)(uVar68 >> 2) & 1);
        uVar125 = (uint)bVar65 * auVar99._8_4_ | (uint)!bVar65 * auVar92._8_4_;
        bVar65 = (bool)((byte)(uVar68 >> 3) & 1);
        uVar126 = (uint)bVar65 * auVar99._12_4_ | (uint)!bVar65 * auVar92._12_4_;
        bVar65 = (bool)((byte)(uVar68 >> 4) & 1);
        uVar127 = (uint)bVar65 * auVar99._16_4_ | (uint)!bVar65 * auVar92._16_4_;
        bVar65 = (bool)((byte)(uVar68 >> 5) & 1);
        uVar128 = (uint)bVar65 * auVar99._20_4_ | (uint)!bVar65 * auVar92._20_4_;
        bVar65 = (bool)((byte)(uVar68 >> 6) & 1);
        uVar129 = (uint)bVar65 * auVar99._24_4_ | (uint)!bVar65 * auVar92._24_4_;
        bVar65 = SUB81(uVar68 >> 7,0);
        uVar130 = (uint)bVar65 * auVar99._28_4_ | (uint)!bVar65 * auVar92._28_4_;
        auVar109._0_4_ = (bVar61 & 1) * uVar69 | !(bool)(bVar61 & 1) * auVar109._0_4_;
        bVar65 = (bool)((byte)(uVar67 >> 1) & 1);
        auVar109._4_4_ = bVar65 * uVar124 | !bVar65 * auVar109._4_4_;
        bVar65 = (bool)((byte)(uVar67 >> 2) & 1);
        auVar109._8_4_ = bVar65 * uVar125 | !bVar65 * auVar109._8_4_;
        bVar65 = (bool)((byte)(uVar67 >> 3) & 1);
        auVar109._12_4_ = bVar65 * uVar126 | !bVar65 * auVar109._12_4_;
        bVar65 = (bool)((byte)(uVar67 >> 4) & 1);
        auVar109._16_4_ = bVar65 * uVar127 | !bVar65 * auVar109._16_4_;
        bVar65 = (bool)((byte)(uVar67 >> 5) & 1);
        auVar109._20_4_ = bVar65 * uVar128 | !bVar65 * auVar109._20_4_;
        bVar65 = (bool)((byte)(uVar67 >> 6) & 1);
        auVar109._24_4_ = bVar65 * uVar129 | !bVar65 * auVar109._24_4_;
        bVar65 = SUB81(uVar67 >> 7,0);
        auVar109._28_4_ = bVar65 * uVar130 | !bVar65 * auVar109._28_4_;
        auVar92 = vblendmps_avx512vl(auVar86,auVar92);
        bVar65 = (bool)((byte)(uVar68 >> 1) & 1);
        bVar11 = (bool)((byte)(uVar68 >> 2) & 1);
        bVar12 = (bool)((byte)(uVar68 >> 3) & 1);
        bVar13 = (bool)((byte)(uVar68 >> 4) & 1);
        bVar14 = (bool)((byte)(uVar68 >> 5) & 1);
        bVar15 = (bool)((byte)(uVar68 >> 6) & 1);
        bVar16 = SUB81(uVar68 >> 7,0);
        auVar110._0_4_ =
             (uint)(bVar61 & 1) *
             ((uint)(bVar60 & 1) * auVar92._0_4_ | !(bool)(bVar60 & 1) * uVar69) |
             !(bool)(bVar61 & 1) * auVar110._0_4_;
        bVar10 = (bool)((byte)(uVar67 >> 1) & 1);
        auVar110._4_4_ =
             (uint)bVar10 * ((uint)bVar65 * auVar92._4_4_ | !bVar65 * uVar124) |
             !bVar10 * auVar110._4_4_;
        bVar65 = (bool)((byte)(uVar67 >> 2) & 1);
        auVar110._8_4_ =
             (uint)bVar65 * ((uint)bVar11 * auVar92._8_4_ | !bVar11 * uVar125) |
             !bVar65 * auVar110._8_4_;
        bVar65 = (bool)((byte)(uVar67 >> 3) & 1);
        auVar110._12_4_ =
             (uint)bVar65 * ((uint)bVar12 * auVar92._12_4_ | !bVar12 * uVar126) |
             !bVar65 * auVar110._12_4_;
        bVar65 = (bool)((byte)(uVar67 >> 4) & 1);
        auVar110._16_4_ =
             (uint)bVar65 * ((uint)bVar13 * auVar92._16_4_ | !bVar13 * uVar127) |
             !bVar65 * auVar110._16_4_;
        bVar65 = (bool)((byte)(uVar67 >> 5) & 1);
        auVar110._20_4_ =
             (uint)bVar65 * ((uint)bVar14 * auVar92._20_4_ | !bVar14 * uVar128) |
             !bVar65 * auVar110._20_4_;
        bVar65 = (bool)((byte)(uVar67 >> 6) & 1);
        auVar110._24_4_ =
             (uint)bVar65 * ((uint)bVar15 * auVar92._24_4_ | !bVar15 * uVar129) |
             !bVar65 * auVar110._24_4_;
        bVar65 = SUB81(uVar67 >> 7,0);
        auVar110._28_4_ =
             (uint)bVar65 * ((uint)bVar16 * auVar92._28_4_ | !bVar16 * uVar130) |
             !bVar65 * auVar110._28_4_;
        bVar58 = (~bVar61 | bVar60) & bVar58;
      }
      auVar54._4_4_ = uStack_39c;
      auVar54._0_4_ = local_3a0;
      auVar54._8_4_ = uStack_398;
      auVar54._12_4_ = uStack_394;
      auVar54._16_4_ = uStack_390;
      auVar54._20_4_ = uStack_38c;
      auVar54._24_4_ = uStack_388;
      auVar54._28_4_ = uStack_384;
      if ((bVar58 & 0x7f) == 0) {
        auVar102._8_4_ = 0x3f800000;
        auVar102._0_8_ = 0x3f8000003f800000;
        auVar102._12_4_ = 0x3f800000;
        auVar102._16_4_ = 0x3f800000;
        auVar102._20_4_ = 0x3f800000;
        auVar102._24_4_ = 0x3f800000;
        auVar102._28_4_ = 0x3f800000;
        goto LAB_01b9c8f0;
      }
      auVar86 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar99 = vxorps_avx512vl(auVar98,auVar86);
      auVar103 = vxorps_avx512vl(auVar96,auVar86);
      auVar96 = vxorps_avx512vl(auVar97,auVar86);
      auVar78 = vsubss_avx512f(ZEXT416((uint)(ray->org).field_0.m128[3]),local_490);
      auVar92 = vbroadcastss_avx512vl(auVar78);
      auVar97 = vmaxps_avx512vl(auVar92,auVar109);
      auVar78 = vsubss_avx512f(ZEXT416((uint)ray->tfar),local_490);
      auVar92 = vbroadcastss_avx512vl(auVar78);
      auVar98 = vminps_avx512vl(auVar92,auVar110);
      auVar92 = vmulps_avx512vl(auVar113,auVar104);
      auVar92 = vfmadd213ps_avx512vl(auVar101,auVar112,auVar92);
      auVar78 = vfmadd213ps_fma(auVar100,auVar111,auVar92);
      auVar92 = vmulps_avx512vl(auVar54,auVar113);
      auVar276 = ZEXT3264(local_620);
      auVar92 = vfmadd231ps_avx512vl(auVar92,local_620,auVar112);
      auVar100 = vfmadd231ps_avx512vl(auVar92,local_380,auVar111);
      auVar258._8_4_ = 0x7fffffff;
      auVar258._0_8_ = 0x7fffffff7fffffff;
      auVar258._12_4_ = 0x7fffffff;
      auVar258._16_4_ = 0x7fffffff;
      auVar258._20_4_ = 0x7fffffff;
      auVar258._24_4_ = 0x7fffffff;
      auVar258._28_4_ = 0x7fffffff;
      auVar92 = vandps_avx(auVar258,auVar100);
      auVar101 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
      uVar21 = vcmpps_avx512vl(auVar92,auVar101,1);
      auVar92 = vxorps_avx512vl(ZEXT1632(auVar78),auVar86);
      auVar104 = vrcp14ps_avx512vl(auVar100);
      auVar111 = vxorps_avx512vl(auVar100,auVar86);
      auVar102 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar112 = vfnmadd213ps_avx512vl(auVar104,auVar100,auVar102);
      auVar78 = vfmadd132ps_fma(auVar112,auVar104,auVar104);
      fVar201 = auVar78._0_4_ * auVar92._0_4_;
      fVar246 = auVar78._4_4_ * auVar92._4_4_;
      auVar42._4_4_ = fVar246;
      auVar42._0_4_ = fVar201;
      fVar250 = auVar78._8_4_ * auVar92._8_4_;
      auVar42._8_4_ = fVar250;
      fVar251 = auVar78._12_4_ * auVar92._12_4_;
      auVar42._12_4_ = fVar251;
      fVar252 = auVar92._16_4_ * 0.0;
      auVar42._16_4_ = fVar252;
      fVar216 = auVar92._20_4_ * 0.0;
      auVar42._20_4_ = fVar216;
      fVar217 = auVar92._24_4_ * 0.0;
      auVar42._24_4_ = fVar217;
      auVar42._28_4_ = auVar92._28_4_;
      uVar22 = vcmpps_avx512vl(auVar100,auVar111,1);
      bVar61 = (byte)uVar21 | (byte)uVar22;
      auVar112 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar113 = vblendmps_avx512vl(auVar42,auVar112);
      auVar114._0_4_ =
           (uint)(bVar61 & 1) * auVar113._0_4_ | (uint)!(bool)(bVar61 & 1) * auVar104._0_4_;
      bVar65 = (bool)(bVar61 >> 1 & 1);
      auVar114._4_4_ = (uint)bVar65 * auVar113._4_4_ | (uint)!bVar65 * auVar104._4_4_;
      bVar65 = (bool)(bVar61 >> 2 & 1);
      auVar114._8_4_ = (uint)bVar65 * auVar113._8_4_ | (uint)!bVar65 * auVar104._8_4_;
      bVar65 = (bool)(bVar61 >> 3 & 1);
      auVar114._12_4_ = (uint)bVar65 * auVar113._12_4_ | (uint)!bVar65 * auVar104._12_4_;
      bVar65 = (bool)(bVar61 >> 4 & 1);
      auVar114._16_4_ = (uint)bVar65 * auVar113._16_4_ | (uint)!bVar65 * auVar104._16_4_;
      bVar65 = (bool)(bVar61 >> 5 & 1);
      auVar114._20_4_ = (uint)bVar65 * auVar113._20_4_ | (uint)!bVar65 * auVar104._20_4_;
      bVar65 = (bool)(bVar61 >> 6 & 1);
      auVar114._24_4_ = (uint)bVar65 * auVar113._24_4_ | (uint)!bVar65 * auVar104._24_4_;
      auVar114._28_4_ =
           (uint)(bVar61 >> 7) * auVar113._28_4_ | (uint)!(bool)(bVar61 >> 7) * auVar104._28_4_;
      auVar97 = vmaxps_avx512vl(auVar97,auVar114);
      auVar260 = ZEXT3264(auVar97);
      uVar22 = vcmpps_avx512vl(auVar100,auVar111,6);
      bVar61 = (byte)uVar21 | (byte)uVar22;
      auVar115._0_4_ = (uint)(bVar61 & 1) * 0x7f800000 | (uint)!(bool)(bVar61 & 1) * (int)fVar201;
      bVar65 = (bool)(bVar61 >> 1 & 1);
      auVar115._4_4_ = (uint)bVar65 * 0x7f800000 | (uint)!bVar65 * (int)fVar246;
      bVar65 = (bool)(bVar61 >> 2 & 1);
      auVar115._8_4_ = (uint)bVar65 * 0x7f800000 | (uint)!bVar65 * (int)fVar250;
      bVar65 = (bool)(bVar61 >> 3 & 1);
      auVar115._12_4_ = (uint)bVar65 * 0x7f800000 | (uint)!bVar65 * (int)fVar251;
      bVar65 = (bool)(bVar61 >> 4 & 1);
      auVar115._16_4_ = (uint)bVar65 * 0x7f800000 | (uint)!bVar65 * (int)fVar252;
      bVar65 = (bool)(bVar61 >> 5 & 1);
      auVar115._20_4_ = (uint)bVar65 * 0x7f800000 | (uint)!bVar65 * (int)fVar216;
      bVar65 = (bool)(bVar61 >> 6 & 1);
      auVar115._24_4_ = (uint)bVar65 * 0x7f800000 | (uint)!bVar65 * (int)fVar217;
      auVar115._28_4_ =
           (uint)(bVar61 >> 7) * 0x7f800000 | (uint)!(bool)(bVar61 >> 7) * auVar92._28_4_;
      auVar92 = vminps_avx512vl(auVar98,auVar115);
      auVar78 = vxorps_avx512vl(auVar98._0_16_,auVar98._0_16_);
      auVar100 = vsubps_avx512vl(ZEXT1632(auVar78),auVar93);
      auVar93 = vsubps_avx512vl(ZEXT1632(auVar78),auVar94);
      auVar98 = ZEXT1632(auVar78);
      auVar94 = vsubps_avx512vl(auVar98,auVar95);
      auVar94 = vmulps_avx512vl(auVar94,auVar99);
      auVar93 = vfmadd231ps_avx512vl(auVar94,auVar96,auVar93);
      auVar100 = vfmadd231ps_avx512vl(auVar93,auVar103,auVar100);
      auVar99 = vmulps_avx512vl(auVar54,auVar99);
      auVar99 = vfmadd231ps_avx512vl(auVar99,local_620,auVar96);
      auVar99 = vfmadd231ps_avx512vl(auVar99,local_380,auVar103);
      auVar38._8_4_ = 0x7fffffff;
      auVar38._0_8_ = 0x7fffffff7fffffff;
      auVar38._12_4_ = 0x7fffffff;
      auVar38._16_4_ = 0x7fffffff;
      auVar38._20_4_ = 0x7fffffff;
      auVar38._24_4_ = 0x7fffffff;
      auVar38._28_4_ = 0x7fffffff;
      vandps_avx512vl(auVar99,auVar38);
      uVar21 = vcmpps_avx512vl(auVar99,auVar101,1);
      auVar100 = vxorps_avx512vl(auVar100,auVar86);
      auVar101 = vrcp14ps_avx512vl(auVar99);
      auVar86 = vxorps_avx512vl(auVar99,auVar86);
      auVar256 = ZEXT3264(auVar86);
      auVar103 = vfnmadd213ps_avx512vl(auVar101,auVar99,auVar102);
      auVar78 = vfmadd132ps_fma(auVar103,auVar101,auVar101);
      auVar263 = ZEXT1664(auVar78);
      fVar201 = auVar78._0_4_ * auVar100._0_4_;
      fVar246 = auVar78._4_4_ * auVar100._4_4_;
      auVar43._4_4_ = fVar246;
      auVar43._0_4_ = fVar201;
      fVar250 = auVar78._8_4_ * auVar100._8_4_;
      auVar43._8_4_ = fVar250;
      fVar251 = auVar78._12_4_ * auVar100._12_4_;
      auVar43._12_4_ = fVar251;
      fVar252 = auVar100._16_4_ * 0.0;
      auVar43._16_4_ = fVar252;
      fVar216 = auVar100._20_4_ * 0.0;
      auVar43._20_4_ = fVar216;
      fVar217 = auVar100._24_4_ * 0.0;
      auVar43._24_4_ = fVar217;
      auVar43._28_4_ = auVar100._28_4_;
      uVar22 = vcmpps_avx512vl(auVar99,auVar86,1);
      bVar61 = (byte)uVar21 | (byte)uVar22;
      auVar103 = vblendmps_avx512vl(auVar43,auVar112);
      auVar116._0_4_ =
           (uint)(bVar61 & 1) * auVar103._0_4_ | (uint)!(bool)(bVar61 & 1) * auVar101._0_4_;
      bVar65 = (bool)(bVar61 >> 1 & 1);
      auVar116._4_4_ = (uint)bVar65 * auVar103._4_4_ | (uint)!bVar65 * auVar101._4_4_;
      bVar65 = (bool)(bVar61 >> 2 & 1);
      auVar116._8_4_ = (uint)bVar65 * auVar103._8_4_ | (uint)!bVar65 * auVar101._8_4_;
      bVar65 = (bool)(bVar61 >> 3 & 1);
      auVar116._12_4_ = (uint)bVar65 * auVar103._12_4_ | (uint)!bVar65 * auVar101._12_4_;
      bVar65 = (bool)(bVar61 >> 4 & 1);
      auVar116._16_4_ = (uint)bVar65 * auVar103._16_4_ | (uint)!bVar65 * auVar101._16_4_;
      bVar65 = (bool)(bVar61 >> 5 & 1);
      auVar116._20_4_ = (uint)bVar65 * auVar103._20_4_ | (uint)!bVar65 * auVar101._20_4_;
      bVar65 = (bool)(bVar61 >> 6 & 1);
      auVar116._24_4_ = (uint)bVar65 * auVar103._24_4_ | (uint)!bVar65 * auVar101._24_4_;
      auVar116._28_4_ =
           (uint)(bVar61 >> 7) * auVar103._28_4_ | (uint)!(bool)(bVar61 >> 7) * auVar101._28_4_;
      _local_5a0 = vmaxps_avx(auVar97,auVar116);
      auVar253 = ZEXT3264(_local_5a0);
      uVar22 = vcmpps_avx512vl(auVar99,auVar86,6);
      bVar61 = (byte)uVar21 | (byte)uVar22;
      auVar117._0_4_ = (uint)(bVar61 & 1) * 0x7f800000 | (uint)!(bool)(bVar61 & 1) * (int)fVar201;
      bVar65 = (bool)(bVar61 >> 1 & 1);
      auVar117._4_4_ = (uint)bVar65 * 0x7f800000 | (uint)!bVar65 * (int)fVar246;
      bVar65 = (bool)(bVar61 >> 2 & 1);
      auVar117._8_4_ = (uint)bVar65 * 0x7f800000 | (uint)!bVar65 * (int)fVar250;
      bVar65 = (bool)(bVar61 >> 3 & 1);
      auVar117._12_4_ = (uint)bVar65 * 0x7f800000 | (uint)!bVar65 * (int)fVar251;
      bVar65 = (bool)(bVar61 >> 4 & 1);
      auVar117._16_4_ = (uint)bVar65 * 0x7f800000 | (uint)!bVar65 * (int)fVar252;
      bVar65 = (bool)(bVar61 >> 5 & 1);
      auVar117._20_4_ = (uint)bVar65 * 0x7f800000 | (uint)!bVar65 * (int)fVar216;
      bVar65 = (bool)(bVar61 >> 6 & 1);
      auVar117._24_4_ = (uint)bVar65 * 0x7f800000 | (uint)!bVar65 * (int)fVar217;
      auVar117._28_4_ =
           (uint)(bVar61 >> 7) * 0x7f800000 | (uint)!(bool)(bVar61 >> 7) * auVar100._28_4_;
      local_2e0 = vminps_avx(auVar92,auVar117);
      auVar249 = ZEXT3264(local_2e0);
      auVar92 = _local_5a0;
      uVar21 = vcmpps_avx512vl(_local_5a0,local_2e0,2);
      bVar58 = bVar58 & 0x7f & (byte)uVar21;
      if (bVar58 == 0) goto LAB_01b9c8f0;
      auVar99 = vmaxps_avx512vl(auVar98,local_8e0);
      auVar86 = vfmadd213ps_avx512vl(auVar90,auVar106,auVar83);
      auVar86 = vmulps_avx512vl(auVar82,auVar86);
      auVar100 = vfmadd213ps_avx512vl(local_640,auVar106,auVar83);
      fVar201 = auVar82._0_4_;
      fVar246 = auVar82._4_4_;
      auVar44._4_4_ = fVar246 * auVar100._4_4_;
      auVar44._0_4_ = fVar201 * auVar100._0_4_;
      fVar250 = auVar82._8_4_;
      auVar44._8_4_ = fVar250 * auVar100._8_4_;
      fVar251 = auVar82._12_4_;
      auVar44._12_4_ = fVar251 * auVar100._12_4_;
      fVar252 = auVar82._16_4_;
      auVar44._16_4_ = fVar252 * auVar100._16_4_;
      fVar216 = auVar82._20_4_;
      auVar44._20_4_ = fVar216 * auVar100._20_4_;
      fVar217 = auVar82._24_4_;
      auVar44._24_4_ = fVar217 * auVar100._24_4_;
      auVar44._28_4_ = auVar100._28_4_;
      auVar86 = vminps_avx512vl(auVar86,auVar102);
      auVar100 = SUB6432(ZEXT864(0),0) << 0x20;
      auVar86 = vmaxps_avx(auVar86,ZEXT832(0) << 0x20);
      auVar101 = vminps_avx512vl(auVar44,auVar102);
      auVar45._4_4_ = (auVar86._4_4_ + 1.0) * 0.125;
      auVar45._0_4_ = (auVar86._0_4_ + 0.0) * 0.125;
      auVar45._8_4_ = (auVar86._8_4_ + 2.0) * 0.125;
      auVar45._12_4_ = (auVar86._12_4_ + 3.0) * 0.125;
      auVar45._16_4_ = (auVar86._16_4_ + 4.0) * 0.125;
      auVar45._20_4_ = (auVar86._20_4_ + 5.0) * 0.125;
      auVar45._24_4_ = (auVar86._24_4_ + 6.0) * 0.125;
      auVar45._28_4_ = auVar86._28_4_ + 7.0;
      local_1a0 = vfmadd213ps_avx512vl(auVar45,local_760,local_600);
      auVar86 = vmaxps_avx(auVar101,ZEXT832(0) << 0x20);
      auVar46._4_4_ = (auVar86._4_4_ + 1.0) * 0.125;
      auVar46._0_4_ = (auVar86._0_4_ + 0.0) * 0.125;
      auVar46._8_4_ = (auVar86._8_4_ + 2.0) * 0.125;
      auVar46._12_4_ = (auVar86._12_4_ + 3.0) * 0.125;
      auVar46._16_4_ = (auVar86._16_4_ + 4.0) * 0.125;
      auVar46._20_4_ = (auVar86._20_4_ + 5.0) * 0.125;
      auVar46._24_4_ = (auVar86._24_4_ + 6.0) * 0.125;
      auVar46._28_4_ = auVar86._28_4_ + 7.0;
      local_1c0 = vfmadd213ps_avx512vl(auVar46,local_760,local_600);
      auVar47._4_4_ = auVar99._4_4_ * auVar99._4_4_;
      auVar47._0_4_ = auVar99._0_4_ * auVar99._0_4_;
      auVar47._8_4_ = auVar99._8_4_ * auVar99._8_4_;
      auVar47._12_4_ = auVar99._12_4_ * auVar99._12_4_;
      auVar47._16_4_ = auVar99._16_4_ * auVar99._16_4_;
      auVar47._20_4_ = auVar99._20_4_ * auVar99._20_4_;
      auVar47._24_4_ = auVar99._24_4_ * auVar99._24_4_;
      auVar47._28_4_ = auVar99._28_4_;
      auVar86 = vsubps_avx(local_580,auVar47);
      auVar48._4_4_ = auVar86._4_4_ * (float)local_4e0._4_4_;
      auVar48._0_4_ = auVar86._0_4_ * (float)local_4e0._0_4_;
      auVar48._8_4_ = auVar86._8_4_ * fStack_4d8;
      auVar48._12_4_ = auVar86._12_4_ * fStack_4d4;
      auVar48._16_4_ = auVar86._16_4_ * fStack_4d0;
      auVar48._20_4_ = auVar86._20_4_ * fStack_4cc;
      auVar48._24_4_ = auVar86._24_4_ * fStack_4c8;
      auVar48._28_4_ = auVar99._28_4_;
      auVar99 = vsubps_avx(local_4c0,auVar48);
      uVar67 = vcmpps_avx512vl(auVar99,ZEXT832(0) << 0x20,5);
      auVar272 = ZEXT3264(local_6a0);
      auVar277 = ZEXT3264(local_6c0);
      auVar278 = ZEXT3264(local_6e0);
      auVar279 = ZEXT3264(local_700);
      auVar280 = ZEXT3264(local_780);
      if ((byte)uVar67 == 0) {
        uVar67 = 0;
        auVar82 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar263 = ZEXT864(0) << 0x20;
        auVar99 = SUB6432(ZEXT864(0),0) << 0x20;
        auVar101 = SUB6432(ZEXT864(0),0) << 0x20;
        auVar253 = ZEXT864(0) << 0x20;
        auVar118._8_4_ = 0x7f800000;
        auVar118._0_8_ = 0x7f8000007f800000;
        auVar118._12_4_ = 0x7f800000;
        auVar118._16_4_ = 0x7f800000;
        auVar118._20_4_ = 0x7f800000;
        auVar118._24_4_ = 0x7f800000;
        auVar118._28_4_ = 0x7f800000;
        auVar119._8_4_ = 0xff800000;
        auVar119._0_8_ = 0xff800000ff800000;
        auVar119._12_4_ = 0xff800000;
        auVar119._16_4_ = 0xff800000;
        auVar119._20_4_ = 0xff800000;
        auVar119._24_4_ = 0xff800000;
        auVar119._28_4_ = 0xff800000;
      }
      else {
        auVar77 = vxorps_avx512vl(auVar136,auVar136);
        uVar68 = vcmpps_avx512vl(auVar99,auVar98,5);
        auVar99 = vsqrtps_avx(auVar99);
        auVar100 = vfnmadd213ps_avx512vl(auVar108,local_3e0,auVar102);
        auVar103 = vfmadd132ps_avx512vl(auVar100,local_3e0,local_3e0);
        auVar100 = vsubps_avx(local_660,auVar99);
        auVar90 = vmulps_avx512vl(auVar100,auVar103);
        auVar99 = vsubps_avx512vl(auVar99,auVar107);
        auVar103 = vmulps_avx512vl(auVar99,auVar103);
        auVar99 = vfmadd213ps_avx512vl(auVar106,auVar90,auVar83);
        auVar49._4_4_ = fVar246 * auVar99._4_4_;
        auVar49._0_4_ = fVar201 * auVar99._0_4_;
        auVar49._8_4_ = fVar250 * auVar99._8_4_;
        auVar49._12_4_ = fVar251 * auVar99._12_4_;
        auVar49._16_4_ = fVar252 * auVar99._16_4_;
        auVar49._20_4_ = fVar216 * auVar99._20_4_;
        auVar49._24_4_ = fVar217 * auVar99._24_4_;
        auVar49._28_4_ = auVar101._28_4_;
        auVar99 = vmulps_avx512vl(local_380,auVar90);
        auVar100 = vmulps_avx512vl(local_620,auVar90);
        auVar55._4_4_ = uStack_39c;
        auVar55._0_4_ = local_3a0;
        auVar55._8_4_ = uStack_398;
        auVar55._12_4_ = uStack_394;
        auVar55._16_4_ = uStack_390;
        auVar55._20_4_ = uStack_38c;
        auVar55._24_4_ = uStack_388;
        auVar55._28_4_ = uStack_384;
        auVar93 = vmulps_avx512vl(auVar55,auVar90);
        auVar101 = vfmadd213ps_avx512vl(auVar84,auVar49,auVar87);
        auVar99 = vsubps_avx512vl(auVar99,auVar101);
        auVar101 = vfmadd213ps_avx512vl(auVar85,auVar49,auVar88);
        auVar101 = vsubps_avx512vl(auVar100,auVar101);
        auVar78 = vfmadd213ps_fma(auVar49,auVar91,auVar89);
        auVar100 = vsubps_avx(auVar93,ZEXT1632(auVar78));
        auVar253 = ZEXT3264(auVar100);
        auVar83 = vfmadd213ps_avx512vl(auVar106,auVar103,auVar83);
        auVar50._4_4_ = fVar246 * auVar83._4_4_;
        auVar50._0_4_ = fVar201 * auVar83._0_4_;
        auVar50._8_4_ = fVar250 * auVar83._8_4_;
        auVar50._12_4_ = fVar251 * auVar83._12_4_;
        auVar50._16_4_ = fVar252 * auVar83._16_4_;
        auVar50._20_4_ = fVar216 * auVar83._20_4_;
        auVar50._24_4_ = fVar217 * auVar83._24_4_;
        auVar50._28_4_ = auVar82._28_4_;
        auVar82 = vmulps_avx512vl(local_380,auVar103);
        auVar83 = vmulps_avx512vl(local_620,auVar103);
        auVar93 = vmulps_avx512vl(auVar55,auVar103);
        auVar78 = vfmadd213ps_fma(auVar84,auVar50,auVar87);
        auVar100 = vsubps_avx(auVar82,ZEXT1632(auVar78));
        auVar78 = vfmadd213ps_fma(auVar85,auVar50,auVar88);
        auVar82 = vsubps_avx(auVar83,ZEXT1632(auVar78));
        auVar78 = vfmadd213ps_fma(auVar91,auVar50,auVar89);
        auVar83 = vsubps_avx512vl(auVar93,ZEXT1632(auVar78));
        auVar263 = ZEXT3264(auVar83);
        auVar145._8_4_ = 0x7f800000;
        auVar145._0_8_ = 0x7f8000007f800000;
        auVar145._12_4_ = 0x7f800000;
        auVar145._16_4_ = 0x7f800000;
        auVar145._20_4_ = 0x7f800000;
        auVar145._24_4_ = 0x7f800000;
        auVar145._28_4_ = 0x7f800000;
        auVar83 = vblendmps_avx512vl(auVar145,auVar90);
        bVar65 = (bool)((byte)uVar68 & 1);
        auVar118._0_4_ = (uint)bVar65 * auVar83._0_4_ | (uint)!bVar65 * 0x7f800000;
        bVar65 = (bool)((byte)(uVar68 >> 1) & 1);
        auVar118._4_4_ = (uint)bVar65 * auVar83._4_4_ | (uint)!bVar65 * 0x7f800000;
        bVar65 = (bool)((byte)(uVar68 >> 2) & 1);
        auVar118._8_4_ = (uint)bVar65 * auVar83._8_4_ | (uint)!bVar65 * 0x7f800000;
        bVar65 = (bool)((byte)(uVar68 >> 3) & 1);
        auVar118._12_4_ = (uint)bVar65 * auVar83._12_4_ | (uint)!bVar65 * 0x7f800000;
        bVar65 = (bool)((byte)(uVar68 >> 4) & 1);
        auVar118._16_4_ = (uint)bVar65 * auVar83._16_4_ | (uint)!bVar65 * 0x7f800000;
        bVar65 = (bool)((byte)(uVar68 >> 5) & 1);
        auVar118._20_4_ = (uint)bVar65 * auVar83._20_4_ | (uint)!bVar65 * 0x7f800000;
        bVar65 = (bool)((byte)(uVar68 >> 6) & 1);
        auVar118._24_4_ = (uint)bVar65 * auVar83._24_4_ | (uint)!bVar65 * 0x7f800000;
        bVar65 = SUB81(uVar68 >> 7,0);
        auVar118._28_4_ = (uint)bVar65 * auVar83._28_4_ | (uint)!bVar65 * 0x7f800000;
        auVar195._8_4_ = 0xff800000;
        auVar195._0_8_ = 0xff800000ff800000;
        auVar195._12_4_ = 0xff800000;
        auVar195._16_4_ = 0xff800000;
        auVar195._20_4_ = 0xff800000;
        auVar195._24_4_ = 0xff800000;
        auVar195._28_4_ = 0xff800000;
        auVar83 = vblendmps_avx512vl(auVar195,auVar103);
        bVar65 = (bool)((byte)uVar68 & 1);
        auVar119._0_4_ = (uint)bVar65 * auVar83._0_4_ | (uint)!bVar65 * -0x800000;
        bVar65 = (bool)((byte)(uVar68 >> 1) & 1);
        auVar119._4_4_ = (uint)bVar65 * auVar83._4_4_ | (uint)!bVar65 * -0x800000;
        bVar65 = (bool)((byte)(uVar68 >> 2) & 1);
        auVar119._8_4_ = (uint)bVar65 * auVar83._8_4_ | (uint)!bVar65 * -0x800000;
        bVar65 = (bool)((byte)(uVar68 >> 3) & 1);
        auVar119._12_4_ = (uint)bVar65 * auVar83._12_4_ | (uint)!bVar65 * -0x800000;
        bVar65 = (bool)((byte)(uVar68 >> 4) & 1);
        auVar119._16_4_ = (uint)bVar65 * auVar83._16_4_ | (uint)!bVar65 * -0x800000;
        bVar65 = (bool)((byte)(uVar68 >> 5) & 1);
        auVar119._20_4_ = (uint)bVar65 * auVar83._20_4_ | (uint)!bVar65 * -0x800000;
        bVar65 = (bool)((byte)(uVar68 >> 6) & 1);
        auVar119._24_4_ = (uint)bVar65 * auVar83._24_4_ | (uint)!bVar65 * -0x800000;
        bVar65 = SUB81(uVar68 >> 7,0);
        auVar119._28_4_ = (uint)bVar65 * auVar83._28_4_ | (uint)!bVar65 * -0x800000;
        auVar39._8_4_ = 0x36000000;
        auVar39._0_8_ = 0x3600000036000000;
        auVar39._12_4_ = 0x36000000;
        auVar39._16_4_ = 0x36000000;
        auVar39._20_4_ = 0x36000000;
        auVar39._24_4_ = 0x36000000;
        auVar39._28_4_ = 0x36000000;
        auVar83 = vmulps_avx512vl(_local_400,auVar39);
        uVar23 = vcmpps_avx512vl(auVar83,local_420,0xe);
        uVar68 = uVar68 & uVar23;
        bVar61 = (byte)uVar68;
        if (bVar61 != 0) {
          uVar23 = vcmpps_avx512vl(auVar86,ZEXT1632(auVar77),2);
          auVar243._8_4_ = 0x7f800000;
          auVar243._0_8_ = 0x7f8000007f800000;
          auVar243._12_4_ = 0x7f800000;
          auVar243._16_4_ = 0x7f800000;
          auVar243._20_4_ = 0x7f800000;
          auVar243._24_4_ = 0x7f800000;
          auVar243._28_4_ = 0x7f800000;
          auVar259._8_4_ = 0xff800000;
          auVar259._0_8_ = 0xff800000ff800000;
          auVar259._12_4_ = 0xff800000;
          auVar259._16_4_ = 0xff800000;
          auVar259._20_4_ = 0xff800000;
          auVar259._24_4_ = 0xff800000;
          auVar259._28_4_ = 0xff800000;
          auVar84 = vblendmps_avx512vl(auVar243,auVar259);
          bVar60 = (byte)uVar23;
          uVar69 = (uint)(bVar60 & 1) * auVar84._0_4_ | (uint)!(bool)(bVar60 & 1) * auVar83._0_4_;
          bVar65 = (bool)((byte)(uVar23 >> 1) & 1);
          uVar124 = (uint)bVar65 * auVar84._4_4_ | (uint)!bVar65 * auVar83._4_4_;
          bVar65 = (bool)((byte)(uVar23 >> 2) & 1);
          uVar125 = (uint)bVar65 * auVar84._8_4_ | (uint)!bVar65 * auVar83._8_4_;
          bVar65 = (bool)((byte)(uVar23 >> 3) & 1);
          uVar126 = (uint)bVar65 * auVar84._12_4_ | (uint)!bVar65 * auVar83._12_4_;
          bVar65 = (bool)((byte)(uVar23 >> 4) & 1);
          uVar127 = (uint)bVar65 * auVar84._16_4_ | (uint)!bVar65 * auVar83._16_4_;
          bVar65 = (bool)((byte)(uVar23 >> 5) & 1);
          uVar128 = (uint)bVar65 * auVar84._20_4_ | (uint)!bVar65 * auVar83._20_4_;
          bVar65 = (bool)((byte)(uVar23 >> 6) & 1);
          uVar129 = (uint)bVar65 * auVar84._24_4_ | (uint)!bVar65 * auVar83._24_4_;
          bVar65 = SUB81(uVar23 >> 7,0);
          uVar130 = (uint)bVar65 * auVar84._28_4_ | (uint)!bVar65 * auVar83._28_4_;
          auVar118._0_4_ = (bVar61 & 1) * uVar69 | !(bool)(bVar61 & 1) * auVar118._0_4_;
          bVar65 = (bool)((byte)(uVar68 >> 1) & 1);
          auVar118._4_4_ = bVar65 * uVar124 | !bVar65 * auVar118._4_4_;
          bVar65 = (bool)((byte)(uVar68 >> 2) & 1);
          auVar118._8_4_ = bVar65 * uVar125 | !bVar65 * auVar118._8_4_;
          bVar65 = (bool)((byte)(uVar68 >> 3) & 1);
          auVar118._12_4_ = bVar65 * uVar126 | !bVar65 * auVar118._12_4_;
          bVar65 = (bool)((byte)(uVar68 >> 4) & 1);
          auVar118._16_4_ = bVar65 * uVar127 | !bVar65 * auVar118._16_4_;
          bVar65 = (bool)((byte)(uVar68 >> 5) & 1);
          auVar118._20_4_ = bVar65 * uVar128 | !bVar65 * auVar118._20_4_;
          bVar65 = (bool)((byte)(uVar68 >> 6) & 1);
          auVar118._24_4_ = bVar65 * uVar129 | !bVar65 * auVar118._24_4_;
          bVar65 = SUB81(uVar68 >> 7,0);
          auVar118._28_4_ = bVar65 * uVar130 | !bVar65 * auVar118._28_4_;
          auVar83 = vblendmps_avx512vl(auVar259,auVar243);
          bVar65 = (bool)((byte)(uVar23 >> 1) & 1);
          bVar11 = (bool)((byte)(uVar23 >> 2) & 1);
          bVar12 = (bool)((byte)(uVar23 >> 3) & 1);
          bVar13 = (bool)((byte)(uVar23 >> 4) & 1);
          bVar14 = (bool)((byte)(uVar23 >> 5) & 1);
          bVar15 = (bool)((byte)(uVar23 >> 6) & 1);
          bVar16 = SUB81(uVar23 >> 7,0);
          auVar119._0_4_ =
               (uint)(bVar61 & 1) *
               ((uint)(bVar60 & 1) * auVar83._0_4_ | !(bool)(bVar60 & 1) * uVar69) |
               !(bool)(bVar61 & 1) * auVar119._0_4_;
          bVar10 = (bool)((byte)(uVar68 >> 1) & 1);
          auVar119._4_4_ =
               (uint)bVar10 * ((uint)bVar65 * auVar83._4_4_ | !bVar65 * uVar124) |
               !bVar10 * auVar119._4_4_;
          bVar65 = (bool)((byte)(uVar68 >> 2) & 1);
          auVar119._8_4_ =
               (uint)bVar65 * ((uint)bVar11 * auVar83._8_4_ | !bVar11 * uVar125) |
               !bVar65 * auVar119._8_4_;
          bVar65 = (bool)((byte)(uVar68 >> 3) & 1);
          auVar119._12_4_ =
               (uint)bVar65 * ((uint)bVar12 * auVar83._12_4_ | !bVar12 * uVar126) |
               !bVar65 * auVar119._12_4_;
          bVar65 = (bool)((byte)(uVar68 >> 4) & 1);
          auVar119._16_4_ =
               (uint)bVar65 * ((uint)bVar13 * auVar83._16_4_ | !bVar13 * uVar127) |
               !bVar65 * auVar119._16_4_;
          bVar65 = (bool)((byte)(uVar68 >> 5) & 1);
          auVar119._20_4_ =
               (uint)bVar65 * ((uint)bVar14 * auVar83._20_4_ | !bVar14 * uVar128) |
               !bVar65 * auVar119._20_4_;
          bVar65 = (bool)((byte)(uVar68 >> 6) & 1);
          auVar119._24_4_ =
               (uint)bVar65 * ((uint)bVar15 * auVar83._24_4_ | !bVar15 * uVar129) |
               !bVar65 * auVar119._24_4_;
          bVar65 = SUB81(uVar68 >> 7,0);
          auVar119._28_4_ =
               (uint)bVar65 * ((uint)bVar16 * auVar83._28_4_ | !bVar16 * uVar130) |
               !bVar65 * auVar119._28_4_;
          uVar67 = (ulong)(byte)((~bVar61 | bVar60) & (byte)uVar67);
        }
      }
      auVar274 = ZEXT3264(local_7a0);
      auVar268 = ZEXT3264(local_7c0);
      auVar269 = ZEXT3264(local_7e0);
      auVar271 = ZEXT3264(local_800);
      auVar273 = ZEXT3264(local_820);
      auVar275 = ZEXT3264(local_840);
      auVar281 = ZEXT3264(local_860);
      uVar132 = *(undefined4 *)&(ray->dir).field_0;
      auVar237._4_4_ = uVar132;
      auVar237._0_4_ = uVar132;
      auVar237._8_4_ = uVar132;
      auVar237._12_4_ = uVar132;
      auVar237._16_4_ = uVar132;
      auVar237._20_4_ = uVar132;
      auVar237._24_4_ = uVar132;
      auVar237._28_4_ = uVar132;
      uVar132 = *(undefined4 *)((long)&(ray->dir).field_0 + 4);
      auVar244._4_4_ = uVar132;
      auVar244._0_4_ = uVar132;
      auVar244._8_4_ = uVar132;
      auVar244._12_4_ = uVar132;
      auVar244._16_4_ = uVar132;
      auVar244._20_4_ = uVar132;
      auVar244._24_4_ = uVar132;
      auVar244._28_4_ = uVar132;
      fVar201 = (ray->dir).field_0.m128[2];
      auVar260 = ZEXT3264(CONCAT428(fVar201,CONCAT424(fVar201,CONCAT420(fVar201,CONCAT416(fVar201,
                                                  CONCAT412(fVar201,CONCAT48(fVar201,CONCAT44(
                                                  fVar201,fVar201))))))));
      auVar232._0_4_ = fVar201 * auVar263._0_4_;
      auVar232._4_4_ = fVar201 * auVar263._4_4_;
      auVar232._8_4_ = fVar201 * auVar263._8_4_;
      auVar232._12_4_ = fVar201 * auVar263._12_4_;
      auVar232._16_4_ = fVar201 * auVar263._16_4_;
      auVar232._20_4_ = fVar201 * auVar263._20_4_;
      auVar232._28_36_ = auVar263._28_36_;
      auVar232._24_4_ = fVar201 * auVar263._24_4_;
      auVar78 = vfmadd231ps_fma(auVar232._0_32_,auVar244,auVar82);
      auVar78 = vfmadd231ps_fma(ZEXT1632(auVar78),auVar237,auVar100);
      auVar255._8_4_ = 0x7fffffff;
      auVar255._0_8_ = 0x7fffffff7fffffff;
      auVar255._12_4_ = 0x7fffffff;
      auVar255._16_4_ = 0x7fffffff;
      auVar255._20_4_ = 0x7fffffff;
      auVar255._24_4_ = 0x7fffffff;
      auVar255._28_4_ = 0x7fffffff;
      auVar256 = ZEXT3264(auVar255);
      auVar82 = vandps_avx(auVar255,ZEXT1632(auVar78));
      auVar263 = ZEXT3264(_local_5a0);
      _local_2c0 = _local_5a0;
      auVar231._8_4_ = 0x3e99999a;
      auVar231._0_8_ = 0x3e99999a3e99999a;
      auVar231._12_4_ = 0x3e99999a;
      auVar231._16_4_ = 0x3e99999a;
      auVar231._20_4_ = 0x3e99999a;
      auVar231._24_4_ = 0x3e99999a;
      auVar231._28_4_ = 0x3e99999a;
      auVar232 = ZEXT3264(auVar231);
      uVar21 = vcmpps_avx512vl(auVar82,auVar231,1);
      local_8ea = (short)uVar21;
      local_3c0 = vmaxps_avx(_local_5a0,auVar119);
      local_300 = local_3c0;
      auVar82 = vminps_avx(local_2e0,auVar118);
      uVar21 = vcmpps_avx512vl(_local_5a0,auVar82,2);
      bVar61 = (byte)uVar21 & bVar58;
      uVar22 = vcmpps_avx512vl(local_3c0,local_2e0,2);
      auVar270 = ZEXT3264(local_680);
      if ((bVar58 & ((byte)uVar22 | (byte)uVar21)) == 0) {
        auVar238 = ZEXT3264(CONCAT428(0x3f800000,
                                      CONCAT424(0x3f800000,
                                                CONCAT420(0x3f800000,
                                                          CONCAT416(0x3f800000,
                                                                    CONCAT412(0x3f800000,
                                                                              CONCAT48(0x3f800000,
                                                                                                                                                                              
                                                  0x3f8000003f800000)))))));
        auVar245 = ZEXT3264(_local_8c0);
      }
      else {
        auVar51._4_4_ = auVar253._4_4_ * fVar201;
        auVar51._0_4_ = auVar253._0_4_ * fVar201;
        auVar51._8_4_ = auVar253._8_4_ * fVar201;
        auVar51._12_4_ = auVar253._12_4_ * fVar201;
        auVar51._16_4_ = auVar253._16_4_ * fVar201;
        auVar51._20_4_ = auVar253._20_4_ * fVar201;
        auVar51._24_4_ = auVar253._24_4_ * fVar201;
        auVar51._28_4_ = auVar82._28_4_;
        auVar78 = vfmadd213ps_fma(auVar101,auVar244,auVar51);
        auVar78 = vfmadd213ps_fma(auVar99,auVar237,ZEXT1632(auVar78));
        auVar82 = vandps_avx(auVar255,ZEXT1632(auVar78));
        uVar21 = vcmpps_avx512vl(auVar82,auVar231,1);
        local_86c = (int)CONCAT71((int7)(uVar67 >> 8),~(byte)uVar67);
        bVar60 = (byte)uVar21 | ~(byte)uVar67;
        auVar147._8_4_ = 2;
        auVar147._0_8_ = 0x200000002;
        auVar147._12_4_ = 2;
        auVar147._16_4_ = 2;
        auVar147._20_4_ = 2;
        auVar147._24_4_ = 2;
        auVar147._28_4_ = 2;
        auVar40._8_4_ = 3;
        auVar40._0_8_ = 0x300000003;
        auVar40._12_4_ = 3;
        auVar40._16_4_ = 3;
        auVar40._20_4_ = 3;
        auVar40._24_4_ = 3;
        auVar40._28_4_ = 3;
        auVar82 = vpblendmd_avx512vl(auVar147,auVar40);
        local_280._0_4_ = (uint)(bVar60 & 1) * auVar82._0_4_ | (uint)!(bool)(bVar60 & 1) * 2;
        bVar65 = (bool)(bVar60 >> 1 & 1);
        local_280._4_4_ = (uint)bVar65 * auVar82._4_4_ | (uint)!bVar65 * 2;
        bVar65 = (bool)(bVar60 >> 2 & 1);
        local_280._8_4_ = (uint)bVar65 * auVar82._8_4_ | (uint)!bVar65 * 2;
        bVar65 = (bool)(bVar60 >> 3 & 1);
        local_280._12_4_ = (uint)bVar65 * auVar82._12_4_ | (uint)!bVar65 * 2;
        bVar65 = (bool)(bVar60 >> 4 & 1);
        local_280._16_4_ = (uint)bVar65 * auVar82._16_4_ | (uint)!bVar65 * 2;
        bVar65 = (bool)(bVar60 >> 5 & 1);
        local_280._20_4_ = (uint)bVar65 * auVar82._20_4_ | (uint)!bVar65 * 2;
        bVar65 = (bool)(bVar60 >> 6 & 1);
        local_280._24_4_ = (uint)bVar65 * auVar82._24_4_ | (uint)!bVar65 * 2;
        local_280._28_4_ = (uint)(bVar60 >> 7) * auVar82._28_4_ | (uint)!(bool)(bVar60 >> 7) * 2;
        local_320 = vpbroadcastd_avx512vl();
        uVar21 = vpcmpd_avx512vl(local_320,local_280,5);
        local_868 = (uint)bVar61;
        bVar61 = (byte)uVar21 & bVar61;
        _local_4e0 = auVar105;
        if (bVar61 == 0) {
          fVar201 = ray->tfar;
          auVar149._4_4_ = fVar201;
          auVar149._0_4_ = fVar201;
          auVar149._8_4_ = fVar201;
          auVar149._12_4_ = fVar201;
          auVar149._16_4_ = fVar201;
          auVar149._20_4_ = fVar201;
          auVar149._24_4_ = fVar201;
          auVar149._28_4_ = fVar201;
          auVar238 = ZEXT3264(CONCAT428(0x3f800000,
                                        CONCAT424(0x3f800000,
                                                  CONCAT420(0x3f800000,
                                                            CONCAT416(0x3f800000,
                                                                      CONCAT412(0x3f800000,
                                                                                CONCAT48(0x3f800000,
                                                                                                                                                                                  
                                                  0x3f8000003f800000)))))));
          auVar245 = ZEXT3264(_local_8c0);
        }
        else {
          auVar77 = vminps_avx(local_500._0_16_,local_540._0_16_);
          auVar78 = vmaxps_avx(local_500._0_16_,local_540._0_16_);
          auVar71 = vminps_avx(local_520._0_16_,local_560._0_16_);
          auVar81 = vminps_avx(auVar77,auVar71);
          auVar77 = vmaxps_avx(local_520._0_16_,local_560._0_16_);
          auVar71 = vmaxps_avx(auVar78,auVar77);
          auVar181._8_4_ = 0x7fffffff;
          auVar181._0_8_ = 0x7fffffff7fffffff;
          auVar181._12_4_ = 0x7fffffff;
          auVar78 = vandps_avx(auVar81,auVar181);
          auVar77 = vandps_avx(auVar71,auVar181);
          auVar78 = vmaxps_avx(auVar78,auVar77);
          auVar77 = vmovshdup_avx(auVar78);
          auVar77 = vmaxss_avx(auVar77,auVar78);
          auVar78 = vshufpd_avx(auVar78,auVar78,1);
          auVar78 = vmaxss_avx(auVar78,auVar77);
          fVar201 = auVar78._0_4_ * 1.9073486e-06;
          local_480 = vshufps_avx(auVar71,auVar71,0xff);
          local_360 = (float)local_5a0._0_4_ + (float)local_8c0._0_4_;
          fStack_35c = (float)local_5a0._4_4_ + (float)local_8c0._4_4_;
          fStack_358 = fStack_598 + fStack_8b8;
          fStack_354 = fStack_594 + fStack_8b4;
          fStack_350 = fStack_590 + fStack_8b0;
          fStack_34c = fStack_58c + fStack_8ac;
          fStack_348 = fStack_588 + fStack_8a8;
          fStack_344 = fStack_584 + fStack_8a4;
          _local_5a0 = auVar92;
          do {
            auVar83 = local_8e0;
            auVar148._8_4_ = 0x7f800000;
            auVar148._0_8_ = 0x7f8000007f800000;
            auVar148._12_4_ = 0x7f800000;
            auVar148._16_4_ = 0x7f800000;
            auVar148._20_4_ = 0x7f800000;
            auVar148._24_4_ = 0x7f800000;
            auVar148._28_4_ = 0x7f800000;
            auVar92 = vblendmps_avx512vl(auVar148,_local_5a0);
            auVar121._0_4_ =
                 (uint)(bVar61 & 1) * auVar92._0_4_ | (uint)!(bool)(bVar61 & 1) * 0x7f800000;
            bVar65 = (bool)(bVar61 >> 1 & 1);
            auVar121._4_4_ = (uint)bVar65 * auVar92._4_4_ | (uint)!bVar65 * 0x7f800000;
            bVar65 = (bool)(bVar61 >> 2 & 1);
            auVar121._8_4_ = (uint)bVar65 * auVar92._8_4_ | (uint)!bVar65 * 0x7f800000;
            bVar65 = (bool)(bVar61 >> 3 & 1);
            auVar121._12_4_ = (uint)bVar65 * auVar92._12_4_ | (uint)!bVar65 * 0x7f800000;
            bVar65 = (bool)(bVar61 >> 4 & 1);
            auVar121._16_4_ = (uint)bVar65 * auVar92._16_4_ | (uint)!bVar65 * 0x7f800000;
            bVar65 = (bool)(bVar61 >> 5 & 1);
            auVar121._20_4_ = (uint)bVar65 * auVar92._20_4_ | (uint)!bVar65 * 0x7f800000;
            bVar65 = (bool)(bVar61 >> 6 & 1);
            auVar121._24_4_ = (uint)bVar65 * auVar92._24_4_ | (uint)!bVar65 * 0x7f800000;
            auVar121._28_4_ =
                 (uint)(bVar61 >> 7) * auVar92._28_4_ | (uint)!(bool)(bVar61 >> 7) * 0x7f800000;
            auVar92 = vshufps_avx(auVar121,auVar121,0xb1);
            auVar92 = vminps_avx(auVar121,auVar92);
            auVar82 = vshufpd_avx(auVar92,auVar92,5);
            auVar92 = vminps_avx(auVar92,auVar82);
            auVar82 = vpermpd_avx2(auVar92,0x4e);
            auVar92 = vminps_avx(auVar92,auVar82);
            uVar21 = vcmpps_avx512vl(auVar121,auVar92,0);
            bVar59 = (byte)uVar21 & bVar61;
            bVar60 = bVar61;
            if (bVar59 != 0) {
              bVar60 = bVar59;
            }
            iVar25 = 0;
            for (uVar69 = (uint)bVar60; (uVar69 & 1) == 0; uVar69 = uVar69 >> 1 | 0x80000000) {
              iVar25 = iVar25 + 1;
            }
            aVar2 = (ray->dir).field_0;
            local_4c0._0_16_ = (undefined1  [16])aVar2;
            auVar78 = vdpps_avx((undefined1  [16])aVar2,(undefined1  [16])aVar2,0x7f);
            if (auVar78._0_4_ < 0.0) {
              local_8e0[1] = 0;
              local_8e0[0] = bVar61;
              local_8e0._2_30_ = auVar83._2_30_;
              local_600._0_16_ = ZEXT416(*(uint *)(local_1a0 + (uint)(iVar25 << 2)));
              local_760._0_16_ = ZEXT416(*(uint *)(local_2c0 + (uint)(iVar25 << 2)));
              fVar246 = sqrtf(auVar78._0_4_);
              bVar61 = local_8e0[0];
              auVar78 = local_760._0_16_;
              auVar77 = local_600._0_16_;
            }
            else {
              auVar78 = vsqrtss_avx(auVar78,auVar78);
              fVar246 = auVar78._0_4_;
              auVar78 = ZEXT416(*(uint *)(local_2c0 + (uint)(iVar25 << 2)));
              auVar77 = ZEXT416(*(uint *)(local_1a0 + (uint)(iVar25 << 2)));
            }
            auVar78 = vinsertps_avx(auVar78,auVar77,0x10);
            auVar253 = ZEXT1664(auVar78);
            bVar65 = true;
            uVar67 = 0;
            do {
              uVar132 = auVar253._0_4_;
              auVar138._4_4_ = uVar132;
              auVar138._0_4_ = uVar132;
              auVar138._8_4_ = uVar132;
              auVar138._12_4_ = uVar132;
              auVar77 = vfmadd132ps_fma(auVar138,ZEXT816(0) << 0x40,local_4c0._0_16_);
              _local_4e0 = auVar253._0_16_;
              auVar78 = vmovshdup_avx(auVar253._0_16_);
              fVar217 = auVar78._0_4_;
              fVar216 = 1.0 - fVar217;
              fVar252 = fVar216 * fVar216 * fVar216;
              fVar250 = fVar217 * fVar217;
              fVar266 = fVar250 * fVar217;
              auVar71 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar252),
                                        ZEXT416((uint)fVar266));
              fVar251 = fVar217 * fVar216;
              local_600._0_16_ = ZEXT416((uint)fVar216);
              local_8e0._0_16_ = auVar78;
              auVar81 = vfmadd231ss_fma(ZEXT416((uint)(fVar251 * fVar217 * 6.0)),
                                        ZEXT416((uint)(fVar251 * fVar216)),
                                        SUB6416(ZEXT464(0x41400000),0));
              auVar78 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar266),
                                        ZEXT416((uint)fVar252));
              auVar236 = vfmadd231ss_fma(ZEXT416((uint)(fVar251 * fVar216 * 6.0)),
                                         SUB6416(ZEXT464(0x41400000),0),
                                         ZEXT416((uint)(fVar251 * fVar217)));
              fVar252 = fVar252 * 0.16666667;
              fVar216 = (auVar71._0_4_ + auVar81._0_4_) * 0.16666667;
              fVar217 = (auVar78._0_4_ + auVar236._0_4_) * 0.16666667;
              fVar266 = fVar266 * 0.16666667;
              auVar182._0_4_ = fVar266 * (float)local_560._0_4_;
              auVar182._4_4_ = fVar266 * (float)local_560._4_4_;
              auVar182._8_4_ = fVar266 * fStack_558;
              auVar182._12_4_ = fVar266 * fStack_554;
              auVar221._4_4_ = fVar217;
              auVar221._0_4_ = fVar217;
              auVar221._8_4_ = fVar217;
              auVar221._12_4_ = fVar217;
              auVar78 = vfmadd132ps_fma(auVar221,auVar182,local_520._0_16_);
              auVar183._4_4_ = fVar216;
              auVar183._0_4_ = fVar216;
              auVar183._8_4_ = fVar216;
              auVar183._12_4_ = fVar216;
              auVar78 = vfmadd132ps_fma(auVar183,auVar78,local_540._0_16_);
              auVar160._4_4_ = fVar252;
              auVar160._0_4_ = fVar252;
              auVar160._8_4_ = fVar252;
              auVar160._12_4_ = fVar252;
              auVar78 = vfmadd132ps_fma(auVar160,auVar78,local_500._0_16_);
              local_3e0._0_16_ = auVar78;
              auVar78 = vsubps_avx(auVar77,auVar78);
              local_760._0_16_ = auVar78;
              auVar78 = vdpps_avx(auVar78,auVar78,0x7f);
              local_580._0_16_ = auVar78;
              if (auVar78._0_4_ < 0.0) {
                local_640._0_4_ = fVar250;
                local_660._0_4_ = fVar251;
                auVar260._0_4_ = sqrtf(auVar78._0_4_);
                auVar260._4_60_ = extraout_var;
                auVar78 = auVar260._0_16_;
                fVar251 = (float)local_660._0_4_;
              }
              else {
                auVar78 = vsqrtss_avx(auVar78,auVar78);
                local_640._0_4_ = fVar250;
              }
              local_400._4_4_ = local_600._0_4_;
              local_400._0_4_ = local_400._4_4_;
              fStack_3f8 = (float)local_400._4_4_;
              fStack_3f4 = (float)local_400._4_4_;
              auVar71 = vfnmsub213ss_fma(local_8e0._0_16_,local_8e0._0_16_,
                                         ZEXT416((uint)(fVar251 * 4.0)));
              auVar77 = vfmadd231ss_fma(ZEXT416((uint)(fVar251 * 4.0)),local_600._0_16_,
                                        local_600._0_16_);
              fVar250 = (float)local_400._4_4_ * -(float)local_400._4_4_ * 0.5;
              fVar251 = auVar71._0_4_ * 0.5;
              fVar252 = auVar77._0_4_ * 0.5;
              local_640._0_4_ = (float)local_640._0_4_ * 0.5;
              auVar203._0_4_ = (float)local_640._0_4_ * (float)local_560._0_4_;
              auVar203._4_4_ = (float)local_640._0_4_ * (float)local_560._4_4_;
              auVar203._8_4_ = (float)local_640._0_4_ * fStack_558;
              auVar203._12_4_ = (float)local_640._0_4_ * fStack_554;
              auVar161._4_4_ = fVar252;
              auVar161._0_4_ = fVar252;
              auVar161._8_4_ = fVar252;
              auVar161._12_4_ = fVar252;
              auVar77 = vfmadd132ps_fma(auVar161,auVar203,local_520._0_16_);
              auVar184._4_4_ = fVar251;
              auVar184._0_4_ = fVar251;
              auVar184._8_4_ = fVar251;
              auVar184._12_4_ = fVar251;
              auVar77 = vfmadd132ps_fma(auVar184,auVar77,local_540._0_16_);
              auVar261._4_4_ = fVar250;
              auVar261._0_4_ = fVar250;
              auVar261._8_4_ = fVar250;
              auVar261._12_4_ = fVar250;
              local_640._0_16_ = vfmadd132ps_fma(auVar261,auVar77,local_500._0_16_);
              local_420._0_16_ = vdpps_avx(local_640._0_16_,local_640._0_16_,0x7f);
              auVar52._12_4_ = 0;
              auVar52._0_12_ = ZEXT812(0);
              fVar250 = local_420._0_4_;
              local_880 = vrsqrt14ss_avx512f(auVar52 << 0x20,ZEXT416((uint)fVar250));
              local_890 = local_880._0_4_ * 1.5;
              local_440 = vrcp14ss_avx512f(auVar52 << 0x20,ZEXT416((uint)fVar250));
              auVar77 = vfnmadd213ss_fma(local_440,local_420._0_16_,ZEXT416(0x40000000));
              local_660._0_4_ = auVar78._0_4_;
              if (fVar250 < -fVar250) {
                fVar251 = sqrtf(fVar250);
                auVar78 = ZEXT416((uint)local_660._0_4_);
                auVar71 = local_640._0_16_;
              }
              else {
                auVar71 = vsqrtss_avx(local_420._0_16_,local_420._0_16_);
                fVar251 = auVar71._0_4_;
                auVar71 = local_640._0_16_;
              }
              fVar252 = local_880._0_4_;
              fVar250 = local_890 + fVar250 * -0.5 * fVar252 * fVar252 * fVar252;
              local_880._0_4_ = auVar71._0_4_ * fVar250;
              local_880._4_4_ = auVar71._4_4_ * fVar250;
              local_880._8_4_ = auVar71._8_4_ * fVar250;
              local_880._12_4_ = auVar71._12_4_ * fVar250;
              auVar81 = vdpps_avx(local_760._0_16_,local_880,0x7f);
              fVar216 = auVar78._0_4_;
              auVar139._0_4_ = auVar81._0_4_ * auVar81._0_4_;
              auVar139._4_4_ = auVar81._4_4_ * auVar81._4_4_;
              auVar139._8_4_ = auVar81._8_4_ * auVar81._8_4_;
              auVar139._12_4_ = auVar81._12_4_ * auVar81._12_4_;
              auVar236 = vsubps_avx(local_580._0_16_,auVar139);
              fVar252 = auVar236._0_4_;
              auVar162._4_12_ = ZEXT812(0) << 0x20;
              auVar162._0_4_ = fVar252;
              auVar72 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar162);
              auVar79 = vmulss_avx512f(auVar72,ZEXT416(0x3fc00000));
              local_890 = fVar252 * -0.5;
              if (fVar252 < 0.0) {
                local_470._4_4_ = fVar250;
                local_470._0_4_ = fVar250;
                fStack_468 = fVar250;
                fStack_464 = fVar250;
                local_460 = auVar72;
                local_450 = auVar81;
                fVar252 = sqrtf(fVar252);
                auVar79 = ZEXT416(auVar79._0_4_);
                auVar78 = ZEXT416((uint)local_660._0_4_);
                auVar72 = local_460;
                auVar71 = local_640._0_16_;
                auVar81 = local_450;
                fVar250 = (float)local_470._0_4_;
                fVar217 = (float)local_470._4_4_;
                fVar266 = fStack_468;
                fVar267 = fStack_464;
              }
              else {
                auVar236 = vsqrtss_avx(auVar236,auVar236);
                fVar252 = auVar236._0_4_;
                fVar217 = fVar250;
                fVar266 = fVar250;
                fVar267 = fVar250;
              }
              auVar263 = ZEXT1664(auVar71);
              auVar260 = ZEXT1664(local_580._0_16_);
              auVar256 = ZEXT1664(local_760._0_16_);
              auVar276 = ZEXT3264(local_620);
              auVar274 = ZEXT3264(local_7a0);
              auVar268 = ZEXT3264(local_7c0);
              auVar269 = ZEXT3264(local_7e0);
              auVar270 = ZEXT3264(local_680);
              auVar271 = ZEXT3264(local_800);
              auVar272 = ZEXT3264(local_6a0);
              auVar273 = ZEXT3264(local_820);
              auVar275 = ZEXT3264(local_840);
              auVar277 = ZEXT3264(local_6c0);
              auVar278 = ZEXT3264(local_6e0);
              auVar279 = ZEXT3264(local_700);
              auVar280 = ZEXT3264(local_780);
              auVar281 = ZEXT3264(local_860);
              auVar254 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_600._0_16_,
                                         local_8e0._0_16_);
              auVar73 = vfmadd213ss_fma(local_8e0._0_16_,SUB6416(ZEXT464(0xc0000000),0),
                                        local_600._0_16_);
              auVar236 = vshufps_avx(_local_4e0,_local_4e0,0x55);
              auVar185._0_4_ = auVar236._0_4_ * (float)local_560._0_4_;
              auVar185._4_4_ = auVar236._4_4_ * (float)local_560._4_4_;
              auVar185._8_4_ = auVar236._8_4_ * fStack_558;
              auVar185._12_4_ = auVar236._12_4_ * fStack_554;
              auVar204._0_4_ = auVar73._0_4_;
              auVar204._4_4_ = auVar204._0_4_;
              auVar204._8_4_ = auVar204._0_4_;
              auVar204._12_4_ = auVar204._0_4_;
              auVar236 = vfmadd132ps_fma(auVar204,auVar185,local_520._0_16_);
              auVar163._0_4_ = auVar254._0_4_;
              auVar163._4_4_ = auVar163._0_4_;
              auVar163._8_4_ = auVar163._0_4_;
              auVar163._12_4_ = auVar163._0_4_;
              auVar236 = vfmadd132ps_fma(auVar163,auVar236,local_540._0_16_);
              auVar236 = vfmadd132ps_fma(_local_400,auVar236,local_500._0_16_);
              auVar164._0_4_ = auVar236._0_4_ * (float)local_420._0_4_;
              auVar164._4_4_ = auVar236._4_4_ * (float)local_420._0_4_;
              auVar164._8_4_ = auVar236._8_4_ * (float)local_420._0_4_;
              auVar164._12_4_ = auVar236._12_4_ * (float)local_420._0_4_;
              auVar236 = vdpps_avx(auVar71,auVar236,0x7f);
              fVar176 = auVar236._0_4_;
              auVar186._0_4_ = auVar71._0_4_ * fVar176;
              auVar186._4_4_ = auVar71._4_4_ * fVar176;
              auVar186._8_4_ = auVar71._8_4_ * fVar176;
              auVar186._12_4_ = auVar71._12_4_ * fVar176;
              auVar236 = vsubps_avx(auVar164,auVar186);
              fVar176 = auVar77._0_4_ * (float)local_440._0_4_;
              auVar254 = vmaxss_avx(ZEXT416((uint)fVar201),
                                    ZEXT416((uint)(local_4e0._0_4_ * fVar246 * 1.9073486e-06)));
              auVar31._8_4_ = 0x80000000;
              auVar31._0_8_ = 0x8000000080000000;
              auVar31._12_4_ = 0x80000000;
              auVar80 = vxorps_avx512vl(auVar71,auVar31);
              auVar187._0_4_ = fVar250 * auVar236._0_4_ * fVar176;
              auVar187._4_4_ = fVar217 * auVar236._4_4_ * fVar176;
              auVar187._8_4_ = fVar266 * auVar236._8_4_ * fVar176;
              auVar187._12_4_ = fVar267 * auVar236._12_4_ * fVar176;
              auVar77 = vdpps_avx(auVar80,local_880,0x7f);
              auVar236 = vfmadd213ss_fma(auVar78,ZEXT416((uint)fVar201),auVar254);
              auVar78 = vdpps_avx(local_760._0_16_,auVar187,0x7f);
              auVar73 = vfmadd213ss_fma(ZEXT416((uint)(fVar216 + 1.0)),
                                        ZEXT416((uint)(fVar201 / fVar251)),auVar236);
              fVar250 = auVar77._0_4_ + auVar78._0_4_;
              auVar78 = vdpps_avx(local_4c0._0_16_,local_880,0x7f);
              auVar77 = vdpps_avx(local_760._0_16_,auVar80,0x7f);
              fVar251 = auVar72._0_4_;
              auVar80 = vaddss_avx512f(auVar79,ZEXT416((uint)(fVar251 * local_890 *
                                                             fVar251 * fVar251)));
              auVar236 = vdpps_avx(local_760._0_16_,local_4c0._0_16_,0x7f);
              auVar79 = vfnmadd231ss_fma(auVar77,auVar81,ZEXT416((uint)fVar250));
              auVar236 = vfnmadd231ss_fma(auVar236,auVar81,auVar78);
              auVar77 = vpermilps_avx(local_3e0._0_16_,0xff);
              fVar252 = fVar252 - auVar77._0_4_;
              auVar72 = vshufps_avx(auVar71,auVar71,0xff);
              auVar77 = vfmsub213ss_fma(auVar79,auVar80,auVar72);
              auVar241._0_8_ = auVar77._0_8_ ^ 0x8000000080000000;
              auVar241._8_4_ = auVar77._8_4_ ^ 0x80000000;
              auVar241._12_4_ = auVar77._12_4_ ^ 0x80000000;
              auVar236 = ZEXT416((uint)(auVar236._0_4_ * auVar80._0_4_));
              auVar79 = vfmsub231ss_fma(ZEXT416((uint)(auVar78._0_4_ * auVar77._0_4_)),
                                        ZEXT416((uint)fVar250),auVar236);
              auVar77 = vinsertps_avx(auVar241,auVar236,0x1c);
              auVar229._0_8_ = auVar78._0_8_ ^ 0x8000000080000000;
              auVar229._8_4_ = auVar78._8_4_ ^ 0x80000000;
              auVar229._12_4_ = auVar78._12_4_ ^ 0x80000000;
              auVar236 = vinsertps_avx(ZEXT416((uint)fVar250),auVar229,0x10);
              auVar205._0_4_ = auVar79._0_4_;
              auVar205._4_4_ = auVar205._0_4_;
              auVar205._8_4_ = auVar205._0_4_;
              auVar205._12_4_ = auVar205._0_4_;
              auVar78 = vdivps_avx(auVar77,auVar205);
              auVar77 = vdivps_avx(auVar236,auVar205);
              fVar250 = auVar81._0_4_;
              auVar232 = ZEXT1664(CONCAT412(fVar252,CONCAT48(fVar252,CONCAT44(fVar252,fVar252))));
              auVar206._0_4_ = fVar250 * auVar78._0_4_ + fVar252 * auVar77._0_4_;
              auVar206._4_4_ = fVar250 * auVar78._4_4_ + fVar252 * auVar77._4_4_;
              auVar206._8_4_ = fVar250 * auVar78._8_4_ + fVar252 * auVar77._8_4_;
              auVar206._12_4_ = fVar250 * auVar78._12_4_ + fVar252 * auVar77._12_4_;
              auVar78 = vsubps_avx(_local_4e0,auVar206);
              auVar253 = ZEXT1664(auVar78);
              auVar32._8_4_ = 0x7fffffff;
              auVar32._0_8_ = 0x7fffffff7fffffff;
              auVar32._12_4_ = 0x7fffffff;
              auVar77 = vandps_avx512vl(auVar81,auVar32);
              if (auVar77._0_4_ < auVar73._0_4_) {
                auVar77 = vfmadd231ss_fma(ZEXT416((uint)(auVar73._0_4_ + auVar254._0_4_)),local_480,
                                          ZEXT416(0x36000000));
                auVar33._8_4_ = 0x7fffffff;
                auVar33._0_8_ = 0x7fffffff7fffffff;
                auVar33._12_4_ = 0x7fffffff;
                auVar81 = vandps_avx512vl(ZEXT416((uint)fVar252),auVar33);
                if (auVar81._0_4_ < auVar77._0_4_) {
                  fVar246 = auVar78._0_4_ + (float)local_490._0_4_;
                  bVar59 = 0;
                  bVar60 = 0;
                  if (fVar246 < (ray->org).field_0.m128[3]) goto LAB_01b9d319;
                  auVar238 = ZEXT3264(CONCAT428(0x3f800000,
                                                CONCAT424(0x3f800000,
                                                          CONCAT420(0x3f800000,
                                                                    CONCAT416(0x3f800000,
                                                                              CONCAT412(0x3f800000,
                                                                                        CONCAT48(
                                                  0x3f800000,0x3f8000003f800000)))))));
                  auVar245 = ZEXT3264(_local_8c0);
                  if (fVar246 <= ray->tfar) {
                    auVar77 = vmovshdup_avx(auVar78);
                    bVar59 = 0;
                    fVar250 = auVar77._0_4_;
                    if ((0.0 <= fVar250) && (fVar250 <= 1.0)) {
                      auVar77 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,ZEXT416((uint)local_580._0_4_)
                                                  );
                      fVar252 = auVar77._0_4_;
                      fVar251 = local_580._0_4_ * -0.5;
                      auVar232 = ZEXT464((uint)fVar251);
                      pGVar5 = (context->scene->geometries).items[local_8e8].ptr;
                      if ((pGVar5->mask & ray->mask) == 0) {
                        bVar59 = 0;
                      }
                      else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                              (bVar59 = 1, pGVar5->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                        local_8e0._0_4_ = ray->tfar;
                        fVar251 = fVar252 * 1.5 + fVar251 * fVar252 * fVar252 * fVar252;
                        auVar207._0_4_ = local_760._0_4_ * fVar251;
                        auVar207._4_4_ = local_760._4_4_ * fVar251;
                        auVar207._8_4_ = local_760._8_4_ * fVar251;
                        auVar207._12_4_ = local_760._12_4_ * fVar251;
                        auVar72 = vfmadd213ps_fma(auVar72,auVar207,auVar71);
                        auVar77 = vshufps_avx(auVar207,auVar207,0xc9);
                        auVar81 = vshufps_avx(auVar71,auVar71,0xc9);
                        auVar208._0_4_ = auVar207._0_4_ * auVar81._0_4_;
                        auVar208._4_4_ = auVar207._4_4_ * auVar81._4_4_;
                        auVar208._8_4_ = auVar207._8_4_ * auVar81._8_4_;
                        auVar208._12_4_ = auVar207._12_4_ * auVar81._12_4_;
                        auVar236 = vfmsub231ps_fma(auVar208,auVar71,auVar77);
                        auVar77 = vshufps_avx(auVar236,auVar236,0xc9);
                        auVar81 = vshufps_avx(auVar72,auVar72,0xc9);
                        auVar232 = ZEXT1664(auVar81);
                        auVar236 = vshufps_avx(auVar236,auVar236,0xd2);
                        auVar140._0_4_ = auVar72._0_4_ * auVar236._0_4_;
                        auVar140._4_4_ = auVar72._4_4_ * auVar236._4_4_;
                        auVar140._8_4_ = auVar72._8_4_ * auVar236._8_4_;
                        auVar140._12_4_ = auVar72._12_4_ * auVar236._12_4_;
                        auVar236 = vfmsub231ps_fma(auVar140,auVar77,auVar81);
                        auVar77 = vshufps_avx(auVar236,auVar236,0xe9);
                        local_5e0 = vmovlps_avx(auVar77);
                        local_5d8 = auVar236._0_4_;
                        local_5d4 = fVar250;
                        local_5d0 = 0;
                        local_5cc = (int)local_5a8;
                        local_5c8 = (int)local_8e8;
                        local_5c4 = context->user->instID[0];
                        local_5c0 = context->user->instPrimID[0];
                        ray->tfar = fVar246;
                        local_8f0 = -1;
                        local_730.valid = &local_8f0;
                        local_730.geometryUserPtr = pGVar5->userPtr;
                        local_730.context = context->user;
                        local_730.ray = (RTCRayN *)ray;
                        local_730.hit = (RTCHitN *)&local_5e0;
                        local_730.N = 1;
                        if (pGVar5->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_01b9d528:
                          p_Var9 = context->args->filter;
                          if ((p_Var9 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar5->field_8).field_0x2 & 0x40) != 0)))) {
                            auVar232 = ZEXT1664(auVar232._0_16_);
                            auVar253 = ZEXT1664(auVar253._0_16_);
                            auVar256 = ZEXT1664(auVar256._0_16_);
                            auVar260 = ZEXT1664(auVar260._0_16_);
                            auVar263 = ZEXT1664(auVar263._0_16_);
                            (*p_Var9)(&local_730);
                            if (*local_730.valid == 0) goto LAB_01b9d575;
                          }
                          bVar59 = 1;
                        }
                        else {
                          auVar232 = ZEXT1664(auVar81);
                          auVar253 = ZEXT1664(auVar78);
                          auVar256 = ZEXT1664(local_760._0_16_);
                          auVar260 = ZEXT1664(local_580._0_16_);
                          auVar263 = ZEXT1664(auVar71);
                          (*pGVar5->occlusionFilterN)(&local_730);
                          if (*local_730.valid != 0) goto LAB_01b9d528;
LAB_01b9d575:
                          ray->tfar = (float)local_8e0._0_4_;
                          bVar59 = 0;
                        }
                        auVar238 = ZEXT3264(CONCAT428(0x3f800000,
                                                      CONCAT424(0x3f800000,
                                                                CONCAT420(0x3f800000,
                                                                          CONCAT416(0x3f800000,
                                                                                    CONCAT412(
                                                  0x3f800000,CONCAT48(0x3f800000,0x3f8000003f800000)
                                                  ))))));
                        auVar245 = ZEXT3264(_local_8c0);
                        auVar276 = ZEXT3264(local_620);
                        auVar274 = ZEXT3264(local_7a0);
                        auVar268 = ZEXT3264(local_7c0);
                        auVar269 = ZEXT3264(local_7e0);
                        auVar270 = ZEXT3264(local_680);
                        auVar271 = ZEXT3264(local_800);
                        auVar272 = ZEXT3264(local_6a0);
                        auVar273 = ZEXT3264(local_820);
                        auVar275 = ZEXT3264(local_840);
                        auVar277 = ZEXT3264(local_6c0);
                        auVar278 = ZEXT3264(local_6e0);
                        auVar279 = ZEXT3264(local_700);
                        auVar280 = ZEXT3264(local_780);
                        auVar281 = ZEXT3264(local_860);
                      }
                    }
                  }
                  goto LAB_01b9d328;
                }
              }
              bVar65 = uVar67 < 4;
              uVar67 = uVar67 + 1;
            } while (uVar67 != 5);
            bVar65 = false;
            bVar60 = 5;
LAB_01b9d319:
            bVar59 = bVar60;
            auVar238 = ZEXT3264(CONCAT428(0x3f800000,
                                          CONCAT424(0x3f800000,
                                                    CONCAT420(0x3f800000,
                                                              CONCAT416(0x3f800000,
                                                                        CONCAT412(0x3f800000,
                                                                                  CONCAT48(
                                                  0x3f800000,0x3f8000003f800000)))))));
            auVar245 = ZEXT3264(_local_8c0);
LAB_01b9d328:
            bVar63 = (bool)(bVar63 | bVar65 & bVar59);
            fVar246 = ray->tfar;
            auVar149._4_4_ = fVar246;
            auVar149._0_4_ = fVar246;
            auVar149._8_4_ = fVar246;
            auVar149._12_4_ = fVar246;
            auVar149._16_4_ = fVar246;
            auVar149._20_4_ = fVar246;
            auVar149._24_4_ = fVar246;
            auVar149._28_4_ = fVar246;
            auVar56._4_4_ = fStack_35c;
            auVar56._0_4_ = local_360;
            auVar56._8_4_ = fStack_358;
            auVar56._12_4_ = fStack_354;
            auVar56._16_4_ = fStack_350;
            auVar56._20_4_ = fStack_34c;
            auVar56._24_4_ = fStack_348;
            auVar56._28_4_ = fStack_344;
            uVar21 = vcmpps_avx512vl(auVar149,auVar56,0xd);
            bVar61 = ~('\x01' << ((byte)iVar25 & 0x1f)) & bVar61 & (byte)uVar21;
          } while (bVar61 != 0);
        }
        auVar249 = ZEXT3264(local_300);
        bVar61 = (byte)local_8ea | (byte)local_86c;
        auVar173._0_4_ = auVar245._0_4_ + local_3c0._0_4_;
        auVar173._4_4_ = auVar245._4_4_ + local_3c0._4_4_;
        auVar173._8_4_ = auVar245._8_4_ + local_3c0._8_4_;
        auVar173._12_4_ = auVar245._12_4_ + local_3c0._12_4_;
        auVar173._16_4_ = auVar245._16_4_ + local_3c0._16_4_;
        auVar173._20_4_ = auVar245._20_4_ + local_3c0._20_4_;
        auVar173._24_4_ = auVar245._24_4_ + local_3c0._24_4_;
        auVar173._28_4_ = auVar245._28_4_ + local_3c0._28_4_;
        uVar21 = vcmpps_avx512vl(auVar173,auVar149,2);
        bVar58 = (byte)uVar22 & bVar58 & (byte)uVar21;
        auVar174._8_4_ = 2;
        auVar174._0_8_ = 0x200000002;
        auVar174._12_4_ = 2;
        auVar174._16_4_ = 2;
        auVar174._20_4_ = 2;
        auVar174._24_4_ = 2;
        auVar174._28_4_ = 2;
        auVar41._8_4_ = 3;
        auVar41._0_8_ = 0x300000003;
        auVar41._12_4_ = 3;
        auVar41._16_4_ = 3;
        auVar41._20_4_ = 3;
        auVar41._24_4_ = 3;
        auVar41._28_4_ = 3;
        auVar92 = vpblendmd_avx512vl(auVar174,auVar41);
        local_3c0._0_4_ = (uint)(bVar61 & 1) * auVar92._0_4_ | (uint)!(bool)(bVar61 & 1) * 2;
        bVar65 = (bool)(bVar61 >> 1 & 1);
        local_3c0._4_4_ = (uint)bVar65 * auVar92._4_4_ | (uint)!bVar65 * 2;
        bVar65 = (bool)(bVar61 >> 2 & 1);
        local_3c0._8_4_ = (uint)bVar65 * auVar92._8_4_ | (uint)!bVar65 * 2;
        bVar65 = (bool)(bVar61 >> 3 & 1);
        local_3c0._12_4_ = (uint)bVar65 * auVar92._12_4_ | (uint)!bVar65 * 2;
        bVar65 = (bool)(bVar61 >> 4 & 1);
        local_3c0._16_4_ = (uint)bVar65 * auVar92._16_4_ | (uint)!bVar65 * 2;
        bVar65 = (bool)(bVar61 >> 5 & 1);
        local_3c0._20_4_ = (uint)bVar65 * auVar92._20_4_ | (uint)!bVar65 * 2;
        bVar65 = (bool)(bVar61 >> 6 & 1);
        local_3c0._24_4_ = (uint)bVar65 * auVar92._24_4_ | (uint)!bVar65 * 2;
        local_3c0._28_4_ = (uint)(bVar61 >> 7) * auVar92._28_4_ | (uint)!(bool)(bVar61 >> 7) * 2;
        uVar21 = vpcmpd_avx512vl(local_320,local_3c0,5);
        bVar61 = (byte)uVar21 & bVar58;
        if (bVar61 != 0) {
          auVar77 = vminps_avx(local_500._0_16_,local_540._0_16_);
          auVar78 = vmaxps_avx(local_500._0_16_,local_540._0_16_);
          auVar71 = vminps_avx(local_520._0_16_,local_560._0_16_);
          auVar81 = vminps_avx(auVar77,auVar71);
          auVar77 = vmaxps_avx(local_520._0_16_,local_560._0_16_);
          auVar71 = vmaxps_avx(auVar78,auVar77);
          auVar188._8_4_ = 0x7fffffff;
          auVar188._0_8_ = 0x7fffffff7fffffff;
          auVar188._12_4_ = 0x7fffffff;
          auVar78 = vandps_avx(auVar81,auVar188);
          auVar77 = vandps_avx(auVar71,auVar188);
          auVar78 = vmaxps_avx(auVar78,auVar77);
          auVar77 = vmovshdup_avx(auVar78);
          auVar77 = vmaxss_avx(auVar77,auVar78);
          auVar78 = vshufpd_avx(auVar78,auVar78,1);
          auVar78 = vmaxss_avx(auVar78,auVar77);
          fVar201 = auVar78._0_4_ * 1.9073486e-06;
          local_480 = vshufps_avx(auVar71,auVar71,0xff);
          local_360 = local_300._0_4_ + auVar245._0_4_;
          fStack_35c = local_300._4_4_ + auVar245._4_4_;
          fStack_358 = local_300._8_4_ + auVar245._8_4_;
          fStack_354 = local_300._12_4_ + auVar245._12_4_;
          fStack_350 = local_300._16_4_ + auVar245._16_4_;
          fStack_34c = local_300._20_4_ + auVar245._20_4_;
          fStack_348 = local_300._24_4_ + auVar245._24_4_;
          fStack_344 = local_300._28_4_ + auVar245._28_4_;
          _local_5a0 = local_300;
          do {
            auVar83 = local_8e0;
            auVar150._8_4_ = 0x7f800000;
            auVar150._0_8_ = 0x7f8000007f800000;
            auVar150._12_4_ = 0x7f800000;
            auVar150._16_4_ = 0x7f800000;
            auVar150._20_4_ = 0x7f800000;
            auVar150._24_4_ = 0x7f800000;
            auVar150._28_4_ = 0x7f800000;
            auVar92 = vblendmps_avx512vl(auVar150,auVar249._0_32_);
            auVar122._0_4_ =
                 (uint)(bVar61 & 1) * auVar92._0_4_ | (uint)!(bool)(bVar61 & 1) * 0x7f800000;
            bVar65 = (bool)(bVar61 >> 1 & 1);
            auVar122._4_4_ = (uint)bVar65 * auVar92._4_4_ | (uint)!bVar65 * 0x7f800000;
            bVar65 = (bool)(bVar61 >> 2 & 1);
            auVar122._8_4_ = (uint)bVar65 * auVar92._8_4_ | (uint)!bVar65 * 0x7f800000;
            bVar65 = (bool)(bVar61 >> 3 & 1);
            auVar122._12_4_ = (uint)bVar65 * auVar92._12_4_ | (uint)!bVar65 * 0x7f800000;
            bVar65 = (bool)(bVar61 >> 4 & 1);
            auVar122._16_4_ = (uint)bVar65 * auVar92._16_4_ | (uint)!bVar65 * 0x7f800000;
            bVar65 = (bool)(bVar61 >> 5 & 1);
            auVar122._20_4_ = (uint)bVar65 * auVar92._20_4_ | (uint)!bVar65 * 0x7f800000;
            bVar65 = (bool)(bVar61 >> 6 & 1);
            auVar122._24_4_ = (uint)bVar65 * auVar92._24_4_ | (uint)!bVar65 * 0x7f800000;
            auVar122._28_4_ =
                 (uint)(bVar61 >> 7) * auVar92._28_4_ | (uint)!(bool)(bVar61 >> 7) * 0x7f800000;
            auVar92 = vshufps_avx(auVar122,auVar122,0xb1);
            auVar92 = vminps_avx(auVar122,auVar92);
            auVar82 = vshufpd_avx(auVar92,auVar92,5);
            auVar92 = vminps_avx(auVar92,auVar82);
            auVar82 = vpermpd_avx2(auVar92,0x4e);
            auVar92 = vminps_avx(auVar92,auVar82);
            uVar21 = vcmpps_avx512vl(auVar122,auVar92,0);
            bVar59 = (byte)uVar21 & bVar61;
            bVar60 = bVar61;
            if (bVar59 != 0) {
              bVar60 = bVar59;
            }
            iVar25 = 0;
            for (uVar69 = (uint)bVar60; (uVar69 & 1) == 0; uVar69 = uVar69 >> 1 | 0x80000000) {
              iVar25 = iVar25 + 1;
            }
            aVar2 = (ray->dir).field_0;
            local_4c0._0_16_ = (undefined1  [16])aVar2;
            auVar78 = vdpps_avx((undefined1  [16])aVar2,(undefined1  [16])aVar2,0x7f);
            if (auVar78._0_4_ < 0.0) {
              local_8e0[1] = 0;
              local_8e0[0] = bVar61;
              local_8e0._2_30_ = auVar83._2_30_;
              local_600._0_16_ = ZEXT416(*(uint *)(local_1c0 + (uint)(iVar25 << 2)));
              local_760._0_16_ = ZEXT416(*(uint *)(local_2e0 + (uint)(iVar25 << 2)));
              fVar246 = sqrtf(auVar78._0_4_);
              bVar61 = local_8e0[0];
              auVar78 = local_760._0_16_;
              auVar77 = local_600._0_16_;
            }
            else {
              auVar78 = vsqrtss_avx(auVar78,auVar78);
              fVar246 = auVar78._0_4_;
              auVar78 = ZEXT416(*(uint *)(local_2e0 + (uint)(iVar25 << 2)));
              auVar77 = ZEXT416(*(uint *)(local_1c0 + (uint)(iVar25 << 2)));
            }
            auVar78 = vinsertps_avx(auVar78,auVar77,0x10);
            auVar253 = ZEXT1664(auVar78);
            bVar65 = true;
            uVar67 = 0;
            do {
              uVar132 = auVar253._0_4_;
              auVar141._4_4_ = uVar132;
              auVar141._0_4_ = uVar132;
              auVar141._8_4_ = uVar132;
              auVar141._12_4_ = uVar132;
              auVar77 = vfmadd132ps_fma(auVar141,ZEXT816(0) << 0x40,local_4c0._0_16_);
              _local_4e0 = auVar253._0_16_;
              auVar78 = vmovshdup_avx(auVar253._0_16_);
              fVar217 = auVar78._0_4_;
              fVar216 = 1.0 - fVar217;
              fVar252 = fVar216 * fVar216 * fVar216;
              fVar250 = fVar217 * fVar217;
              fVar266 = fVar250 * fVar217;
              auVar71 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar252),
                                        ZEXT416((uint)fVar266));
              fVar251 = fVar217 * fVar216;
              local_600._0_16_ = ZEXT416((uint)fVar216);
              local_8e0._0_16_ = auVar78;
              auVar81 = vfmadd231ss_fma(ZEXT416((uint)(fVar251 * fVar217 * 6.0)),
                                        ZEXT416((uint)(fVar251 * fVar216)),
                                        SUB6416(ZEXT464(0x41400000),0));
              auVar78 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar266),
                                        ZEXT416((uint)fVar252));
              auVar236 = vfmadd231ss_fma(ZEXT416((uint)(fVar251 * fVar216 * 6.0)),
                                         SUB6416(ZEXT464(0x41400000),0),
                                         ZEXT416((uint)(fVar251 * fVar217)));
              fVar252 = fVar252 * 0.16666667;
              fVar216 = (auVar71._0_4_ + auVar81._0_4_) * 0.16666667;
              fVar217 = (auVar78._0_4_ + auVar236._0_4_) * 0.16666667;
              fVar266 = fVar266 * 0.16666667;
              auVar189._0_4_ = fVar266 * (float)local_560._0_4_;
              auVar189._4_4_ = fVar266 * (float)local_560._4_4_;
              auVar189._8_4_ = fVar266 * fStack_558;
              auVar189._12_4_ = fVar266 * fStack_554;
              auVar222._4_4_ = fVar217;
              auVar222._0_4_ = fVar217;
              auVar222._8_4_ = fVar217;
              auVar222._12_4_ = fVar217;
              auVar78 = vfmadd132ps_fma(auVar222,auVar189,local_520._0_16_);
              auVar190._4_4_ = fVar216;
              auVar190._0_4_ = fVar216;
              auVar190._8_4_ = fVar216;
              auVar190._12_4_ = fVar216;
              auVar78 = vfmadd132ps_fma(auVar190,auVar78,local_540._0_16_);
              auVar165._4_4_ = fVar252;
              auVar165._0_4_ = fVar252;
              auVar165._8_4_ = fVar252;
              auVar165._12_4_ = fVar252;
              auVar78 = vfmadd132ps_fma(auVar165,auVar78,local_500._0_16_);
              local_3e0._0_16_ = auVar78;
              auVar78 = vsubps_avx(auVar77,auVar78);
              local_760._0_16_ = auVar78;
              auVar78 = vdpps_avx(auVar78,auVar78,0x7f);
              local_580._0_16_ = auVar78;
              if (auVar78._0_4_ < 0.0) {
                local_640._0_4_ = fVar250;
                local_660._0_4_ = fVar251;
                auVar263._0_4_ = sqrtf(auVar78._0_4_);
                auVar263._4_60_ = extraout_var_00;
                auVar78 = auVar263._0_16_;
                fVar251 = (float)local_660._0_4_;
              }
              else {
                auVar78 = vsqrtss_avx(auVar78,auVar78);
                local_640._0_4_ = fVar250;
              }
              local_400._4_4_ = local_600._0_4_;
              local_400._0_4_ = local_400._4_4_;
              fStack_3f8 = (float)local_400._4_4_;
              fStack_3f4 = (float)local_400._4_4_;
              auVar71 = vfnmsub213ss_fma(local_8e0._0_16_,local_8e0._0_16_,
                                         ZEXT416((uint)(fVar251 * 4.0)));
              auVar77 = vfmadd231ss_fma(ZEXT416((uint)(fVar251 * 4.0)),local_600._0_16_,
                                        local_600._0_16_);
              fVar250 = (float)local_400._4_4_ * -(float)local_400._4_4_ * 0.5;
              fVar251 = auVar71._0_4_ * 0.5;
              fVar252 = auVar77._0_4_ * 0.5;
              local_640._0_4_ = (float)local_640._0_4_ * 0.5;
              auVar209._0_4_ = (float)local_640._0_4_ * (float)local_560._0_4_;
              auVar209._4_4_ = (float)local_640._0_4_ * (float)local_560._4_4_;
              auVar209._8_4_ = (float)local_640._0_4_ * fStack_558;
              auVar209._12_4_ = (float)local_640._0_4_ * fStack_554;
              auVar166._4_4_ = fVar252;
              auVar166._0_4_ = fVar252;
              auVar166._8_4_ = fVar252;
              auVar166._12_4_ = fVar252;
              auVar77 = vfmadd132ps_fma(auVar166,auVar209,local_520._0_16_);
              auVar191._4_4_ = fVar251;
              auVar191._0_4_ = fVar251;
              auVar191._8_4_ = fVar251;
              auVar191._12_4_ = fVar251;
              auVar77 = vfmadd132ps_fma(auVar191,auVar77,local_540._0_16_);
              auVar262._4_4_ = fVar250;
              auVar262._0_4_ = fVar250;
              auVar262._8_4_ = fVar250;
              auVar262._12_4_ = fVar250;
              local_640._0_16_ = vfmadd132ps_fma(auVar262,auVar77,local_500._0_16_);
              local_420._0_16_ = vdpps_avx(local_640._0_16_,local_640._0_16_,0x7f);
              auVar53._12_4_ = 0;
              auVar53._0_12_ = ZEXT812(0);
              fVar250 = local_420._0_4_;
              auVar71 = vrsqrt14ss_avx512f(auVar53 << 0x20,ZEXT416((uint)fVar250));
              local_890 = auVar71._0_4_ * 1.5;
              local_440 = vrcp14ss_avx512f(auVar53 << 0x20,ZEXT416((uint)fVar250));
              auVar77 = vfnmadd213ss_fma(local_440,local_420._0_16_,ZEXT416(0x40000000));
              local_660._0_4_ = auVar78._0_4_;
              if (fVar250 < -fVar250) {
                local_880 = auVar71;
                fVar251 = sqrtf(fVar250);
                auVar78 = ZEXT416((uint)local_660._0_4_);
                auVar71 = local_880;
                auVar81 = local_640._0_16_;
              }
              else {
                auVar81 = vsqrtss_avx(local_420._0_16_,local_420._0_16_);
                fVar251 = auVar81._0_4_;
                auVar81 = local_640._0_16_;
              }
              fVar252 = auVar71._0_4_;
              local_890 = local_890 + fVar250 * -0.5 * fVar252 * fVar252 * fVar252;
              fStack_88c = local_890;
              fStack_888 = local_890;
              fStack_884 = local_890;
              auVar265._0_4_ = auVar81._0_4_ * local_890;
              auVar265._4_4_ = auVar81._4_4_ * local_890;
              auVar265._8_4_ = auVar81._8_4_ * local_890;
              auVar265._12_4_ = auVar81._12_4_ * local_890;
              auVar71 = vdpps_avx(local_760._0_16_,auVar265,0x7f);
              fVar252 = auVar78._0_4_;
              auVar142._0_4_ = auVar71._0_4_ * auVar71._0_4_;
              auVar142._4_4_ = auVar71._4_4_ * auVar71._4_4_;
              auVar142._8_4_ = auVar71._8_4_ * auVar71._8_4_;
              auVar142._12_4_ = auVar71._12_4_ * auVar71._12_4_;
              auVar236 = vsubps_avx(local_580._0_16_,auVar142);
              fVar250 = auVar236._0_4_;
              auVar167._4_12_ = ZEXT812(0) << 0x20;
              auVar167._0_4_ = fVar250;
              auVar72 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar167);
              auVar79 = vmulss_avx512f(auVar72,ZEXT416(0x3fc00000));
              local_880._0_4_ = fVar250 * -0.5;
              if (fVar250 < 0.0) {
                _local_470 = auVar265;
                local_460 = auVar72;
                local_450 = auVar71;
                fVar250 = sqrtf(fVar250);
                auVar79 = ZEXT416(auVar79._0_4_);
                auVar78 = ZEXT416((uint)local_660._0_4_);
                auVar72 = local_460;
                auVar81 = local_640._0_16_;
                auVar71 = local_450;
                auVar265 = _local_470;
              }
              else {
                auVar236 = vsqrtss_avx(auVar236,auVar236);
                fVar250 = auVar236._0_4_;
              }
              auVar263 = ZEXT1664(auVar81);
              auVar260 = ZEXT1664(local_580._0_16_);
              auVar256 = ZEXT1664(local_760._0_16_);
              auVar276 = ZEXT3264(local_620);
              auVar274 = ZEXT3264(local_7a0);
              auVar268 = ZEXT3264(local_7c0);
              auVar269 = ZEXT3264(local_7e0);
              auVar270 = ZEXT3264(local_680);
              auVar271 = ZEXT3264(local_800);
              auVar272 = ZEXT3264(local_6a0);
              auVar273 = ZEXT3264(local_820);
              auVar275 = ZEXT3264(local_840);
              auVar277 = ZEXT3264(local_6c0);
              auVar278 = ZEXT3264(local_6e0);
              auVar279 = ZEXT3264(local_700);
              auVar280 = ZEXT3264(local_780);
              auVar281 = ZEXT3264(local_860);
              auVar254 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_600._0_16_,
                                         local_8e0._0_16_);
              auVar73 = vfmadd213ss_fma(local_8e0._0_16_,SUB6416(ZEXT464(0xc0000000),0),
                                        local_600._0_16_);
              auVar236 = vshufps_avx(_local_4e0,_local_4e0,0x55);
              auVar192._0_4_ = auVar236._0_4_ * (float)local_560._0_4_;
              auVar192._4_4_ = auVar236._4_4_ * (float)local_560._4_4_;
              auVar192._8_4_ = auVar236._8_4_ * fStack_558;
              auVar192._12_4_ = auVar236._12_4_ * fStack_554;
              auVar210._0_4_ = auVar73._0_4_;
              auVar210._4_4_ = auVar210._0_4_;
              auVar210._8_4_ = auVar210._0_4_;
              auVar210._12_4_ = auVar210._0_4_;
              auVar236 = vfmadd132ps_fma(auVar210,auVar192,local_520._0_16_);
              auVar168._0_4_ = auVar254._0_4_;
              auVar168._4_4_ = auVar168._0_4_;
              auVar168._8_4_ = auVar168._0_4_;
              auVar168._12_4_ = auVar168._0_4_;
              auVar236 = vfmadd132ps_fma(auVar168,auVar236,local_540._0_16_);
              auVar236 = vfmadd132ps_fma(_local_400,auVar236,local_500._0_16_);
              auVar169._0_4_ = auVar236._0_4_ * (float)local_420._0_4_;
              auVar169._4_4_ = auVar236._4_4_ * (float)local_420._0_4_;
              auVar169._8_4_ = auVar236._8_4_ * (float)local_420._0_4_;
              auVar169._12_4_ = auVar236._12_4_ * (float)local_420._0_4_;
              auVar236 = vdpps_avx(auVar81,auVar236,0x7f);
              fVar216 = auVar236._0_4_;
              auVar193._0_4_ = auVar81._0_4_ * fVar216;
              auVar193._4_4_ = auVar81._4_4_ * fVar216;
              auVar193._8_4_ = auVar81._8_4_ * fVar216;
              auVar193._12_4_ = auVar81._12_4_ * fVar216;
              auVar236 = vsubps_avx(auVar169,auVar193);
              fVar216 = auVar77._0_4_ * (float)local_440._0_4_;
              auVar254 = vmaxss_avx(ZEXT416((uint)fVar201),
                                    ZEXT416((uint)(local_4e0._0_4_ * fVar246 * 1.9073486e-06)));
              auVar34._8_4_ = 0x80000000;
              auVar34._0_8_ = 0x8000000080000000;
              auVar34._12_4_ = 0x80000000;
              auVar80 = vxorps_avx512vl(auVar81,auVar34);
              auVar194._0_4_ = auVar236._0_4_ * fVar216 * local_890;
              auVar194._4_4_ = auVar236._4_4_ * fVar216 * fStack_88c;
              auVar194._8_4_ = auVar236._8_4_ * fVar216 * fStack_888;
              auVar194._12_4_ = auVar236._12_4_ * fVar216 * fStack_884;
              auVar77 = vdpps_avx(auVar80,auVar265,0x7f);
              auVar236 = vfmadd213ss_fma(auVar78,ZEXT416((uint)fVar201),auVar254);
              auVar78 = vdpps_avx(local_760._0_16_,auVar194,0x7f);
              auVar73 = vfmadd213ss_fma(ZEXT416((uint)(fVar252 + 1.0)),
                                        ZEXT416((uint)(fVar201 / fVar251)),auVar236);
              fVar251 = auVar77._0_4_ + auVar78._0_4_;
              auVar78 = vdpps_avx(local_4c0._0_16_,auVar265,0x7f);
              auVar77 = vdpps_avx(local_760._0_16_,auVar80,0x7f);
              fVar252 = auVar72._0_4_;
              auVar80 = vaddss_avx512f(auVar79,ZEXT416((uint)(fVar252 * (float)local_880._0_4_ *
                                                             fVar252 * fVar252)));
              auVar236 = vdpps_avx(local_760._0_16_,local_4c0._0_16_,0x7f);
              auVar79 = vfnmadd231ss_fma(auVar77,auVar71,ZEXT416((uint)fVar251));
              auVar236 = vfnmadd231ss_fma(auVar236,auVar71,auVar78);
              auVar77 = vpermilps_avx(local_3e0._0_16_,0xff);
              fVar250 = fVar250 - auVar77._0_4_;
              auVar72 = vshufps_avx(auVar81,auVar81,0xff);
              auVar77 = vfmsub213ss_fma(auVar79,auVar80,auVar72);
              auVar242._0_8_ = auVar77._0_8_ ^ 0x8000000080000000;
              auVar242._8_4_ = auVar77._8_4_ ^ 0x80000000;
              auVar242._12_4_ = auVar77._12_4_ ^ 0x80000000;
              auVar236 = ZEXT416((uint)(auVar236._0_4_ * auVar80._0_4_));
              auVar79 = vfmsub231ss_fma(ZEXT416((uint)(auVar78._0_4_ * auVar77._0_4_)),
                                        ZEXT416((uint)fVar251),auVar236);
              auVar77 = vinsertps_avx(auVar242,auVar236,0x1c);
              auVar230._0_8_ = auVar78._0_8_ ^ 0x8000000080000000;
              auVar230._8_4_ = auVar78._8_4_ ^ 0x80000000;
              auVar230._12_4_ = auVar78._12_4_ ^ 0x80000000;
              auVar236 = vinsertps_avx(ZEXT416((uint)fVar251),auVar230,0x10);
              auVar211._0_4_ = auVar79._0_4_;
              auVar211._4_4_ = auVar211._0_4_;
              auVar211._8_4_ = auVar211._0_4_;
              auVar211._12_4_ = auVar211._0_4_;
              auVar78 = vdivps_avx(auVar77,auVar211);
              auVar77 = vdivps_avx(auVar236,auVar211);
              fVar251 = auVar71._0_4_;
              auVar232 = ZEXT1664(CONCAT412(fVar250,CONCAT48(fVar250,CONCAT44(fVar250,fVar250))));
              auVar212._0_4_ = fVar251 * auVar78._0_4_ + fVar250 * auVar77._0_4_;
              auVar212._4_4_ = fVar251 * auVar78._4_4_ + fVar250 * auVar77._4_4_;
              auVar212._8_4_ = fVar251 * auVar78._8_4_ + fVar250 * auVar77._8_4_;
              auVar212._12_4_ = fVar251 * auVar78._12_4_ + fVar250 * auVar77._12_4_;
              auVar78 = vsubps_avx(_local_4e0,auVar212);
              auVar253 = ZEXT1664(auVar78);
              auVar35._8_4_ = 0x7fffffff;
              auVar35._0_8_ = 0x7fffffff7fffffff;
              auVar35._12_4_ = 0x7fffffff;
              auVar77 = vandps_avx512vl(auVar71,auVar35);
              if (auVar77._0_4_ < auVar73._0_4_) {
                auVar77 = vfmadd231ss_fma(ZEXT416((uint)(auVar73._0_4_ + auVar254._0_4_)),local_480,
                                          ZEXT416(0x36000000));
                auVar36._8_4_ = 0x7fffffff;
                auVar36._0_8_ = 0x7fffffff7fffffff;
                auVar36._12_4_ = 0x7fffffff;
                auVar71 = vandps_avx512vl(ZEXT416((uint)fVar250),auVar36);
                if (auVar71._0_4_ < auVar77._0_4_) {
                  fVar246 = auVar78._0_4_ + (float)local_490._0_4_;
                  bVar59 = 0;
                  bVar60 = 0;
                  if (fVar246 < (ray->org).field_0.m128[3]) goto LAB_01b9de4f;
                  auVar238 = ZEXT3264(CONCAT428(0x3f800000,
                                                CONCAT424(0x3f800000,
                                                          CONCAT420(0x3f800000,
                                                                    CONCAT416(0x3f800000,
                                                                              CONCAT412(0x3f800000,
                                                                                        CONCAT48(
                                                  0x3f800000,0x3f8000003f800000)))))));
                  auVar245 = ZEXT3264(_local_8c0);
                  auVar249 = ZEXT3264(_local_5a0);
                  if (ray->tfar < fVar246) goto LAB_01b9de58;
                  auVar77 = vmovshdup_avx(auVar78);
                  bVar59 = 0;
                  fVar250 = auVar77._0_4_;
                  if ((fVar250 < 0.0) || (1.0 < fVar250)) goto LAB_01b9de58;
                  auVar77 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,ZEXT416((uint)local_580._0_4_));
                  fVar252 = auVar77._0_4_;
                  fVar251 = local_580._0_4_ * -0.5;
                  auVar232 = ZEXT464((uint)fVar251);
                  pGVar5 = (context->scene->geometries).items[local_8e8].ptr;
                  if ((pGVar5->mask & ray->mask) == 0) {
                    bVar59 = 0;
                    goto LAB_01b9de58;
                  }
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (bVar59 = 1, pGVar5->occlusionFilterN == (RTCFilterFunctionN)0x0))
                  goto LAB_01b9de58;
                  local_8e0._0_4_ = ray->tfar;
                  fVar251 = fVar252 * 1.5 + fVar251 * fVar252 * fVar252 * fVar252;
                  auVar213._0_4_ = local_760._0_4_ * fVar251;
                  auVar213._4_4_ = local_760._4_4_ * fVar251;
                  auVar213._8_4_ = local_760._8_4_ * fVar251;
                  auVar213._12_4_ = local_760._12_4_ * fVar251;
                  auVar72 = vfmadd213ps_fma(auVar72,auVar213,auVar81);
                  auVar77 = vshufps_avx(auVar213,auVar213,0xc9);
                  auVar71 = vshufps_avx(auVar81,auVar81,0xc9);
                  auVar214._0_4_ = auVar213._0_4_ * auVar71._0_4_;
                  auVar214._4_4_ = auVar213._4_4_ * auVar71._4_4_;
                  auVar214._8_4_ = auVar213._8_4_ * auVar71._8_4_;
                  auVar214._12_4_ = auVar213._12_4_ * auVar71._12_4_;
                  auVar236 = vfmsub231ps_fma(auVar214,auVar81,auVar77);
                  auVar77 = vshufps_avx(auVar236,auVar236,0xc9);
                  auVar71 = vshufps_avx(auVar72,auVar72,0xc9);
                  auVar232 = ZEXT1664(auVar71);
                  auVar236 = vshufps_avx(auVar236,auVar236,0xd2);
                  auVar143._0_4_ = auVar72._0_4_ * auVar236._0_4_;
                  auVar143._4_4_ = auVar72._4_4_ * auVar236._4_4_;
                  auVar143._8_4_ = auVar72._8_4_ * auVar236._8_4_;
                  auVar143._12_4_ = auVar72._12_4_ * auVar236._12_4_;
                  auVar236 = vfmsub231ps_fma(auVar143,auVar77,auVar71);
                  auVar77 = vshufps_avx(auVar236,auVar236,0xe9);
                  local_5e0 = vmovlps_avx(auVar77);
                  local_5d8 = auVar236._0_4_;
                  local_5d4 = fVar250;
                  local_5d0 = 0;
                  local_5cc = (int)local_5a8;
                  local_5c8 = (int)local_8e8;
                  local_5c4 = context->user->instID[0];
                  local_5c0 = context->user->instPrimID[0];
                  ray->tfar = fVar246;
                  local_8f0 = -1;
                  local_730.valid = &local_8f0;
                  local_730.geometryUserPtr = pGVar5->userPtr;
                  local_730.context = context->user;
                  local_730.ray = (RTCRayN *)ray;
                  local_730.hit = (RTCHitN *)&local_5e0;
                  local_730.N = 1;
                  if (pGVar5->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_01b9e061:
                    p_Var9 = context->args->filter;
                    if ((p_Var9 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar5->field_8).field_0x2 & 0x40) != 0)))) {
                      auVar232 = ZEXT1664(auVar232._0_16_);
                      auVar253 = ZEXT1664(auVar253._0_16_);
                      auVar256 = ZEXT1664(auVar256._0_16_);
                      auVar260 = ZEXT1664(auVar260._0_16_);
                      auVar263 = ZEXT1664(auVar263._0_16_);
                      (*p_Var9)(&local_730);
                      if (*local_730.valid == 0) goto LAB_01b9e0ae;
                    }
                    bVar60 = 1;
                  }
                  else {
                    auVar232 = ZEXT1664(auVar71);
                    auVar253 = ZEXT1664(auVar78);
                    auVar256 = ZEXT1664(local_760._0_16_);
                    auVar260 = ZEXT1664(local_580._0_16_);
                    auVar263 = ZEXT1664(auVar81);
                    (*pGVar5->occlusionFilterN)(&local_730);
                    if (*local_730.valid != 0) goto LAB_01b9e061;
LAB_01b9e0ae:
                    ray->tfar = (float)local_8e0._0_4_;
                    bVar60 = 0;
                  }
                  auVar276 = ZEXT3264(local_620);
                  auVar274 = ZEXT3264(local_7a0);
                  auVar268 = ZEXT3264(local_7c0);
                  auVar269 = ZEXT3264(local_7e0);
                  auVar270 = ZEXT3264(local_680);
                  auVar271 = ZEXT3264(local_800);
                  auVar272 = ZEXT3264(local_6a0);
                  auVar273 = ZEXT3264(local_820);
                  auVar275 = ZEXT3264(local_840);
                  auVar277 = ZEXT3264(local_6c0);
                  auVar278 = ZEXT3264(local_6e0);
                  auVar279 = ZEXT3264(local_700);
                  auVar280 = ZEXT3264(local_780);
                  auVar281 = ZEXT3264(local_860);
                  goto LAB_01b9de4f;
                }
              }
              bVar65 = uVar67 < 4;
              uVar67 = uVar67 + 1;
            } while (uVar67 != 5);
            bVar65 = false;
            bVar60 = 5;
LAB_01b9de4f:
            bVar59 = bVar60;
            auVar245 = ZEXT3264(_local_8c0);
            auVar238 = ZEXT3264(CONCAT428(0x3f800000,
                                          CONCAT424(0x3f800000,
                                                    CONCAT420(0x3f800000,
                                                              CONCAT416(0x3f800000,
                                                                        CONCAT412(0x3f800000,
                                                                                  CONCAT48(
                                                  0x3f800000,0x3f8000003f800000)))))));
            auVar249 = ZEXT3264(_local_5a0);
LAB_01b9de58:
            bVar63 = (bool)(bVar63 | bVar65 & bVar59);
            fVar246 = ray->tfar;
            auVar149._4_4_ = fVar246;
            auVar149._0_4_ = fVar246;
            auVar149._8_4_ = fVar246;
            auVar149._12_4_ = fVar246;
            auVar149._16_4_ = fVar246;
            auVar149._20_4_ = fVar246;
            auVar149._24_4_ = fVar246;
            auVar149._28_4_ = fVar246;
            auVar57._4_4_ = fStack_35c;
            auVar57._0_4_ = local_360;
            auVar57._8_4_ = fStack_358;
            auVar57._12_4_ = fStack_354;
            auVar57._16_4_ = fStack_350;
            auVar57._20_4_ = fStack_34c;
            auVar57._24_4_ = fStack_348;
            auVar57._28_4_ = fStack_344;
            uVar21 = vcmpps_avx512vl(auVar149,auVar57,0xd);
            bVar61 = ~('\x01' << ((byte)iVar25 & 0x1f)) & bVar61 & (byte)uVar21;
          } while (bVar61 != 0);
          auVar249 = ZEXT3264(local_300);
        }
        uVar22 = vpcmpgtd_avx512vl(local_3c0,local_320);
        uVar24 = vpcmpd_avx512vl(local_320,local_280,1);
        auVar196._0_4_ = auVar245._0_4_ + (float)local_2c0._0_4_;
        auVar196._4_4_ = auVar245._4_4_ + (float)local_2c0._4_4_;
        auVar196._8_4_ = auVar245._8_4_ + fStack_2b8;
        auVar196._12_4_ = auVar245._12_4_ + fStack_2b4;
        auVar196._16_4_ = auVar245._16_4_ + fStack_2b0;
        auVar196._20_4_ = auVar245._20_4_ + fStack_2ac;
        auVar196._24_4_ = auVar245._24_4_ + fStack_2a8;
        auVar196._28_4_ = auVar245._28_4_ + fStack_2a4;
        uVar21 = vcmpps_avx512vl(auVar196,auVar149,2);
        bVar61 = (byte)local_868 & (byte)uVar24 & (byte)uVar21;
        auVar197._0_4_ = auVar249._0_4_ + auVar245._0_4_;
        auVar197._4_4_ = auVar249._4_4_ + auVar245._4_4_;
        auVar197._8_4_ = auVar249._8_4_ + auVar245._8_4_;
        auVar197._12_4_ = auVar249._12_4_ + auVar245._12_4_;
        auVar197._16_4_ = auVar249._16_4_ + auVar245._16_4_;
        auVar197._20_4_ = auVar249._20_4_ + auVar245._20_4_;
        auVar197._24_4_ = auVar249._24_4_ + auVar245._24_4_;
        auVar197._28_4_ = auVar249._28_4_ + auVar245._28_4_;
        uVar21 = vcmpps_avx512vl(auVar197,auVar149,2);
        bVar58 = bVar58 & (byte)uVar22 & (byte)uVar21 | bVar61;
        if (bVar58 != 0) {
          abStack_180[uVar66 * 0x60] = bVar58;
          auVar123._0_4_ =
               (uint)(bVar61 & 1) * local_2c0._0_4_ |
               (uint)!(bool)(bVar61 & 1) * (int)auVar249._0_4_;
          bVar65 = (bool)(bVar61 >> 1 & 1);
          auVar123._4_4_ = (uint)bVar65 * local_2c0._4_4_ | (uint)!bVar65 * (int)auVar249._4_4_;
          bVar65 = (bool)(bVar61 >> 2 & 1);
          auVar123._8_4_ = (uint)bVar65 * (int)fStack_2b8 | (uint)!bVar65 * (int)auVar249._8_4_;
          bVar65 = (bool)(bVar61 >> 3 & 1);
          auVar123._12_4_ = (uint)bVar65 * (int)fStack_2b4 | (uint)!bVar65 * (int)auVar249._12_4_;
          bVar65 = (bool)(bVar61 >> 4 & 1);
          auVar123._16_4_ = (uint)bVar65 * (int)fStack_2b0 | (uint)!bVar65 * (int)auVar249._16_4_;
          bVar65 = (bool)(bVar61 >> 5 & 1);
          auVar123._20_4_ = (uint)bVar65 * (int)fStack_2ac | (uint)!bVar65 * (int)auVar249._20_4_;
          bVar65 = (bool)(bVar61 >> 6 & 1);
          auVar123._24_4_ = (uint)bVar65 * (int)fStack_2a8 | (uint)!bVar65 * (int)auVar249._24_4_;
          auVar123._28_4_ =
               (uint)(bVar61 >> 7) * (int)fStack_2a4 |
               (uint)!(bool)(bVar61 >> 7) * (int)auVar249._28_4_;
          auVar249 = ZEXT3264(auVar123);
          *(undefined1 (*) [32])(auStack_160 + uVar66 * 0x60) = auVar123;
          uVar67 = vmovlps_avx(local_330);
          (&uStack_140)[uVar66 * 0xc] = uVar67;
          aiStack_138[uVar66 * 0x18] = local_864 + 1;
          uVar66 = (ulong)((int)uVar66 + 1);
        }
      }
    }
    fVar246 = ray->tfar;
    fVar201 = ray->tfar;
    auVar170._4_4_ = fVar201;
    auVar170._0_4_ = fVar201;
    auVar170._8_4_ = fVar201;
    auVar170._12_4_ = fVar201;
    auVar170._16_4_ = fVar201;
    auVar170._20_4_ = fVar201;
    auVar170._24_4_ = fVar201;
    auVar170._28_4_ = fVar201;
    do {
      uVar69 = (uint)uVar66;
      uVar66 = (ulong)(uVar69 - 1);
      if (uVar69 == 0) {
        if (bVar63 != false) {
          return bVar63;
        }
        auVar144._4_4_ = fVar246;
        auVar144._0_4_ = fVar246;
        auVar144._8_4_ = fVar246;
        auVar144._12_4_ = fVar246;
        uVar21 = vcmpps_avx512vl(auVar144,local_340,0xd);
        uVar69 = (uint)uVar21 & (uint)local_428 - 1 & (uint)local_428;
        uVar66 = (ulong)uVar69;
        if (uVar69 == 0) {
          return false;
        }
        goto LAB_01b9bb07;
      }
      lVar62 = uVar66 * 0x60;
      auVar92 = *(undefined1 (*) [32])(auStack_160 + lVar62);
      auVar215._0_4_ = auVar245._0_4_ + auVar92._0_4_;
      auVar215._4_4_ = auVar245._4_4_ + auVar92._4_4_;
      auVar215._8_4_ = auVar245._8_4_ + auVar92._8_4_;
      auVar215._12_4_ = auVar245._12_4_ + auVar92._12_4_;
      auVar215._16_4_ = auVar245._16_4_ + auVar92._16_4_;
      auVar215._20_4_ = auVar245._20_4_ + auVar92._20_4_;
      auVar215._24_4_ = auVar245._24_4_ + auVar92._24_4_;
      auVar215._28_4_ = auVar245._28_4_ + auVar92._28_4_;
      uVar21 = vcmpps_avx512vl(auVar215,auVar170,2);
      uVar124 = (uint)uVar21 & (uint)abStack_180[lVar62];
    } while (uVar124 == 0);
    uVar67 = (&uStack_140)[uVar66 * 0xc];
    auVar137._8_8_ = 0;
    auVar137._0_8_ = uVar67;
    auVar171._8_4_ = 0x7f800000;
    auVar171._0_8_ = 0x7f8000007f800000;
    auVar171._12_4_ = 0x7f800000;
    auVar171._16_4_ = 0x7f800000;
    auVar171._20_4_ = 0x7f800000;
    auVar171._24_4_ = 0x7f800000;
    auVar171._28_4_ = 0x7f800000;
    auVar92 = vblendmps_avx512vl(auVar171,auVar92);
    bVar58 = (byte)uVar124;
    auVar120._0_4_ = (uint)(bVar58 & 1) * auVar92._0_4_ | (uint)!(bool)(bVar58 & 1) * 0x7f800000;
    bVar65 = (bool)((byte)(uVar124 >> 1) & 1);
    auVar120._4_4_ = (uint)bVar65 * auVar92._4_4_ | (uint)!bVar65 * 0x7f800000;
    bVar65 = (bool)((byte)(uVar124 >> 2) & 1);
    auVar120._8_4_ = (uint)bVar65 * auVar92._8_4_ | (uint)!bVar65 * 0x7f800000;
    bVar65 = (bool)((byte)(uVar124 >> 3) & 1);
    auVar120._12_4_ = (uint)bVar65 * auVar92._12_4_ | (uint)!bVar65 * 0x7f800000;
    bVar65 = (bool)((byte)(uVar124 >> 4) & 1);
    auVar120._16_4_ = (uint)bVar65 * auVar92._16_4_ | (uint)!bVar65 * 0x7f800000;
    bVar65 = (bool)((byte)(uVar124 >> 5) & 1);
    auVar120._20_4_ = (uint)bVar65 * auVar92._20_4_ | (uint)!bVar65 * 0x7f800000;
    bVar65 = (bool)((byte)(uVar124 >> 6) & 1);
    auVar120._24_4_ = (uint)bVar65 * auVar92._24_4_ | (uint)!bVar65 * 0x7f800000;
    auVar120._28_4_ = (uVar124 >> 7) * auVar92._28_4_ | (uint)!SUB41(uVar124 >> 7,0) * 0x7f800000;
    auVar92 = vshufps_avx(auVar120,auVar120,0xb1);
    auVar92 = vminps_avx(auVar120,auVar92);
    auVar82 = vshufpd_avx(auVar92,auVar92,5);
    auVar92 = vminps_avx(auVar92,auVar82);
    auVar82 = vpermpd_avx2(auVar92,0x4e);
    auVar92 = vminps_avx(auVar92,auVar82);
    uVar21 = vcmpps_avx512vl(auVar120,auVar92,0);
    bVar61 = (byte)uVar21 & bVar58;
    if (bVar61 != 0) {
      uVar124 = (uint)bVar61;
    }
    uVar125 = 0;
    for (; (uVar124 & 1) == 0; uVar124 = uVar124 >> 1 | 0x80000000) {
      uVar125 = uVar125 + 1;
    }
    local_864 = aiStack_138[uVar66 * 0x18];
    bVar58 = ~('\x01' << ((byte)uVar125 & 0x1f)) & bVar58;
    abStack_180[lVar62] = bVar58;
    if (bVar58 == 0) {
      uVar69 = uVar69 - 1;
    }
    uVar132 = (undefined4)uVar67;
    auVar172._4_4_ = uVar132;
    auVar172._0_4_ = uVar132;
    auVar172._8_4_ = uVar132;
    auVar172._12_4_ = uVar132;
    auVar172._16_4_ = uVar132;
    auVar172._20_4_ = uVar132;
    auVar172._24_4_ = uVar132;
    auVar172._28_4_ = uVar132;
    auVar78 = vmovshdup_avx(auVar137);
    auVar78 = vsubps_avx(auVar78,auVar137);
    auVar146._0_4_ = auVar78._0_4_;
    auVar146._4_4_ = auVar146._0_4_;
    auVar146._8_4_ = auVar146._0_4_;
    auVar146._12_4_ = auVar146._0_4_;
    auVar146._16_4_ = auVar146._0_4_;
    auVar146._20_4_ = auVar146._0_4_;
    auVar146._24_4_ = auVar146._0_4_;
    auVar146._28_4_ = auVar146._0_4_;
    auVar78 = vfmadd132ps_fma(auVar146,auVar172,_DAT_01faff20);
    _local_2c0 = ZEXT1632(auVar78);
    local_330._8_8_ = 0;
    local_330._0_8_ = *(ulong *)(local_2c0 + (ulong)uVar125 * 4);
    uVar66 = (ulong)uVar69;
  } while( true );
}

Assistant:

static __forceinline bool occluded_t(const Precalculations& pre, Ray& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time());

          if (Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,Epilog(ray,context,geomID,primID)))
              return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
        return false;
      }